

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  long lVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  ulong uVar80;
  ulong uVar81;
  byte bVar82;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ulong uVar83;
  long lVar84;
  uint uVar85;
  ulong uVar86;
  bool bVar87;
  ulong uVar88;
  float fVar89;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar137;
  float fVar139;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar96 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar143;
  float fVar144;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar145;
  undefined4 uVar146;
  undefined8 uVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  float fVar158;
  float fVar165;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar166;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  ulong local_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  int iStack_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int iStack_668;
  int iStack_664;
  undefined1 local_660 [16];
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  long local_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined1 local_370 [16];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  int local_2dc;
  undefined1 local_2d0 [16];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  byte local_290;
  float local_280 [4];
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar88 = (ulong)(byte)PVar9;
  lVar70 = uVar88 * 0x19;
  fVar166 = *(float *)(prim + lVar70 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar94 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar95 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar70 + 6));
  fVar157 = fVar166 * auVar95._0_4_;
  fVar145 = fVar166 * auVar94._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar88 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar20);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar88 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar93);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar88 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar92);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar88 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar90);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar114 = vpmovsxbd_avx2(auVar5);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar88 + 6);
  auVar113 = vpmovsxbd_avx2(auVar6);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar86 = (ulong)(uint)((int)(uVar88 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar86 + 6);
  auVar106 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar86 + uVar88 + 6);
  auVar111 = vpmovsxbd_avx2(auVar8);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar111);
  uVar81 = (ulong)(uint)((int)(uVar88 * 5) << 2);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar101 = vpmovsxbd_avx2(auVar91);
  auVar112 = vcvtdq2ps_avx(auVar101);
  auVar188._4_4_ = fVar145;
  auVar188._0_4_ = fVar145;
  auVar188._8_4_ = fVar145;
  auVar188._12_4_ = fVar145;
  auVar188._16_4_ = fVar145;
  auVar188._20_4_ = fVar145;
  auVar188._24_4_ = fVar145;
  auVar188._28_4_ = fVar145;
  auVar191._8_4_ = 1;
  auVar191._0_8_ = 0x100000001;
  auVar191._12_4_ = 1;
  auVar191._16_4_ = 1;
  auVar191._20_4_ = 1;
  auVar191._24_4_ = 1;
  auVar191._28_4_ = 1;
  auVar108 = ZEXT1632(CONCAT412(fVar166 * auVar94._12_4_,
                                CONCAT48(fVar166 * auVar94._8_4_,
                                         CONCAT44(fVar166 * auVar94._4_4_,fVar145))));
  auVar102 = vpermps_avx2(auVar191,auVar108);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = vpermps_avx512vl(auVar99,auVar108);
  fVar145 = auVar100._0_4_;
  fVar171 = auVar100._4_4_;
  auVar108._4_4_ = fVar171 * auVar104._4_4_;
  auVar108._0_4_ = fVar145 * auVar104._0_4_;
  fVar172 = auVar100._8_4_;
  auVar108._8_4_ = fVar172 * auVar104._8_4_;
  fVar173 = auVar100._12_4_;
  auVar108._12_4_ = fVar173 * auVar104._12_4_;
  fVar158 = auVar100._16_4_;
  auVar108._16_4_ = fVar158 * auVar104._16_4_;
  fVar165 = auVar100._20_4_;
  auVar108._20_4_ = fVar165 * auVar104._20_4_;
  fVar89 = auVar100._24_4_;
  auVar108._24_4_ = fVar89 * auVar104._24_4_;
  auVar108._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar113._4_4_ * fVar171;
  auVar111._0_4_ = auVar113._0_4_ * fVar145;
  auVar111._8_4_ = auVar113._8_4_ * fVar172;
  auVar111._12_4_ = auVar113._12_4_ * fVar173;
  auVar111._16_4_ = auVar113._16_4_ * fVar158;
  auVar111._20_4_ = auVar113._20_4_ * fVar165;
  auVar111._24_4_ = auVar113._24_4_ * fVar89;
  auVar111._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar112._4_4_ * fVar171;
  auVar101._0_4_ = auVar112._0_4_ * fVar145;
  auVar101._8_4_ = auVar112._8_4_ * fVar172;
  auVar101._12_4_ = auVar112._12_4_ * fVar173;
  auVar101._16_4_ = auVar112._16_4_ * fVar158;
  auVar101._20_4_ = auVar112._20_4_ * fVar165;
  auVar101._24_4_ = auVar112._24_4_ * fVar89;
  auVar101._28_4_ = auVar100._28_4_;
  auVar20 = vfmadd231ps_fma(auVar108,auVar102,auVar103);
  auVar93 = vfmadd231ps_fma(auVar111,auVar102,auVar114);
  auVar92 = vfmadd231ps_fma(auVar101,auVar107,auVar102);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar188,auVar105);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar188,auVar115);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar106,auVar188);
  auVar189._4_4_ = fVar157;
  auVar189._0_4_ = fVar157;
  auVar189._8_4_ = fVar157;
  auVar189._12_4_ = fVar157;
  auVar189._16_4_ = fVar157;
  auVar189._20_4_ = fVar157;
  auVar189._24_4_ = fVar157;
  auVar189._28_4_ = fVar157;
  auVar101 = ZEXT1632(CONCAT412(fVar166 * auVar95._12_4_,
                                CONCAT48(fVar166 * auVar95._8_4_,
                                         CONCAT44(fVar166 * auVar95._4_4_,fVar157))));
  auVar111 = vpermps_avx2(auVar191,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  auVar102 = vmulps_avx512vl(auVar101,auVar104);
  auVar110._0_4_ = auVar101._0_4_ * auVar113._0_4_;
  auVar110._4_4_ = auVar101._4_4_ * auVar113._4_4_;
  auVar110._8_4_ = auVar101._8_4_ * auVar113._8_4_;
  auVar110._12_4_ = auVar101._12_4_ * auVar113._12_4_;
  auVar110._16_4_ = auVar101._16_4_ * auVar113._16_4_;
  auVar110._20_4_ = auVar101._20_4_ * auVar113._20_4_;
  auVar110._24_4_ = auVar101._24_4_ * auVar113._24_4_;
  auVar110._28_4_ = 0;
  auVar113._4_4_ = auVar101._4_4_ * auVar112._4_4_;
  auVar113._0_4_ = auVar101._0_4_ * auVar112._0_4_;
  auVar113._8_4_ = auVar101._8_4_ * auVar112._8_4_;
  auVar113._12_4_ = auVar101._12_4_ * auVar112._12_4_;
  auVar113._16_4_ = auVar101._16_4_ * auVar112._16_4_;
  auVar113._20_4_ = auVar101._20_4_ * auVar112._20_4_;
  auVar113._24_4_ = auVar101._24_4_ * auVar112._24_4_;
  auVar113._28_4_ = auVar104._28_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar111,auVar103);
  auVar90 = vfmadd231ps_fma(auVar110,auVar111,auVar114);
  auVar5 = vfmadd231ps_fma(auVar113,auVar111,auVar107);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar189,auVar105);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar189,auVar115);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar189,auVar106);
  auVar180._8_4_ = 0x7fffffff;
  auVar180._0_8_ = 0x7fffffff7fffffff;
  auVar180._12_4_ = 0x7fffffff;
  auVar180._16_4_ = 0x7fffffff;
  auVar180._20_4_ = 0x7fffffff;
  auVar180._24_4_ = 0x7fffffff;
  auVar180._28_4_ = 0x7fffffff;
  auVar105 = vandps_avx(ZEXT1632(auVar20),auVar180);
  auVar127._8_4_ = 0x219392ef;
  auVar127._0_8_ = 0x219392ef219392ef;
  auVar127._12_4_ = 0x219392ef;
  auVar127._16_4_ = 0x219392ef;
  auVar127._20_4_ = 0x219392ef;
  auVar127._24_4_ = 0x219392ef;
  auVar127._28_4_ = 0x219392ef;
  uVar86 = vcmpps_avx512vl(auVar105,auVar127,1);
  bVar87 = (bool)((byte)uVar86 & 1);
  auVar102._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._0_4_;
  bVar87 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._4_4_;
  bVar87 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._8_4_;
  bVar87 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar93),auVar180);
  uVar86 = vcmpps_avx512vl(auVar105,auVar127,1);
  bVar87 = (bool)((byte)uVar86 & 1);
  auVar99._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar93._0_4_;
  bVar87 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar93._4_4_;
  bVar87 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar93._8_4_;
  bVar87 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar93._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar92),auVar180);
  uVar86 = vcmpps_avx512vl(auVar105,auVar127,1);
  bVar87 = (bool)((byte)uVar86 & 1);
  auVar105._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._0_4_;
  bVar87 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._4_4_;
  bVar87 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._8_4_;
  bVar87 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar92._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = &DAT_3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar178._16_4_ = 0x3f800000;
  auVar178._20_4_ = 0x3f800000;
  auVar178._24_4_ = 0x3f800000;
  auVar178._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar102,auVar104,auVar178);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar99);
  auVar93 = vfnmadd213ps_fma(auVar99,auVar104,auVar178);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar105);
  auVar92 = vfnmadd213ps_fma(auVar105,auVar104,auVar178);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar104,auVar104);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar104 = vsubps_avx512vl(auVar105,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 9 + 6));
  auVar106._4_4_ = auVar20._4_4_ * auVar104._4_4_;
  auVar106._0_4_ = auVar20._0_4_ * auVar104._0_4_;
  auVar106._8_4_ = auVar20._8_4_ * auVar104._8_4_;
  auVar106._12_4_ = auVar20._12_4_ * auVar104._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx512vl(auVar105,auVar103);
  auVar126._0_4_ = auVar20._0_4_ * auVar105._0_4_;
  auVar126._4_4_ = auVar20._4_4_ * auVar105._4_4_;
  auVar126._8_4_ = auVar20._8_4_ * auVar105._8_4_;
  auVar126._12_4_ = auVar20._12_4_ * auVar105._12_4_;
  auVar126._16_4_ = auVar105._16_4_ * 0.0;
  auVar126._20_4_ = auVar105._20_4_ * 0.0;
  auVar126._24_4_ = auVar105._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar88 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar90));
  auVar107._4_4_ = auVar93._4_4_ * auVar105._4_4_;
  auVar107._0_4_ = auVar93._0_4_ * auVar105._0_4_;
  auVar107._8_4_ = auVar93._8_4_ * auVar105._8_4_;
  auVar107._12_4_ = auVar93._12_4_ * auVar105._12_4_;
  auVar107._16_4_ = auVar105._16_4_ * 0.0;
  auVar107._20_4_ = auVar105._20_4_ * 0.0;
  auVar107._24_4_ = auVar105._24_4_ * 0.0;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar90));
  auVar109._0_4_ = auVar93._0_4_ * auVar105._0_4_;
  auVar109._4_4_ = auVar93._4_4_ * auVar105._4_4_;
  auVar109._8_4_ = auVar93._8_4_ * auVar105._8_4_;
  auVar109._12_4_ = auVar93._12_4_ * auVar105._12_4_;
  auVar109._16_4_ = auVar105._16_4_ * 0.0;
  auVar109._20_4_ = auVar105._20_4_ * 0.0;
  auVar109._24_4_ = auVar105._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar88 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar5));
  auVar112._4_4_ = auVar105._4_4_ * auVar92._4_4_;
  auVar112._0_4_ = auVar105._0_4_ * auVar92._0_4_;
  auVar112._8_4_ = auVar105._8_4_ * auVar92._8_4_;
  auVar112._12_4_ = auVar105._12_4_ * auVar92._12_4_;
  auVar112._16_4_ = auVar105._16_4_ * 0.0;
  auVar112._20_4_ = auVar105._20_4_ * 0.0;
  auVar112._24_4_ = auVar105._24_4_ * 0.0;
  auVar112._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar5));
  auVar100._0_4_ = auVar92._0_4_ * auVar105._0_4_;
  auVar100._4_4_ = auVar92._4_4_ * auVar105._4_4_;
  auVar100._8_4_ = auVar92._8_4_ * auVar105._8_4_;
  auVar100._12_4_ = auVar92._12_4_ * auVar105._12_4_;
  auVar100._16_4_ = auVar105._16_4_ * 0.0;
  auVar100._20_4_ = auVar105._20_4_ * 0.0;
  auVar100._24_4_ = auVar105._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar106,auVar126);
  auVar103 = vpminsd_avx2(auVar107,auVar109);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar112,auVar100);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar104._4_4_ = uVar146;
  auVar104._0_4_ = uVar146;
  auVar104._8_4_ = uVar146;
  auVar104._12_4_ = uVar146;
  auVar104._16_4_ = uVar146;
  auVar104._20_4_ = uVar146;
  auVar104._24_4_ = uVar146;
  auVar104._28_4_ = uVar146;
  auVar103 = vmaxps_avx512vl(auVar103,auVar104);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar105,auVar103);
  auVar179 = ZEXT3264(local_80);
  auVar105 = vpmaxsd_avx2(auVar106,auVar126);
  auVar156 = ZEXT3264(auVar105);
  auVar103 = vpmaxsd_avx2(auVar107,auVar109);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar112,auVar100);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar115._4_4_ = uVar146;
  auVar115._0_4_ = uVar146;
  auVar115._8_4_ = uVar146;
  auVar115._12_4_ = uVar146;
  auVar115._16_4_ = uVar146;
  auVar115._20_4_ = uVar146;
  auVar115._24_4_ = uVar146;
  auVar115._28_4_ = uVar146;
  auVar103 = vminps_avx512vl(auVar103,auVar115);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar114._8_4_ = 0x3f800003;
  auVar114._0_8_ = 0x3f8000033f800003;
  auVar114._12_4_ = 0x3f800003;
  auVar114._16_4_ = 0x3f800003;
  auVar114._20_4_ = 0x3f800003;
  auVar114._24_4_ = 0x3f800003;
  auVar114._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar114);
  auVar103 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar147 = vcmpps_avx512vl(local_80,auVar105,2);
  bVar87 = (byte)((byte)uVar147 & (byte)uVar21) != 0;
  if (bVar87) {
    uVar86 = (ulong)(byte)((byte)uVar147 & (byte)uVar21);
    local_460 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar103 = auVar179._0_32_;
      auVar105 = auVar156._0_32_;
      local_4e0 = in_ZMM21._0_32_;
      local_4c0 = in_ZMM20._0_32_;
      lVar84 = 0;
      for (uVar88 = uVar86; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
        lVar84 = lVar84 + 1;
      }
      uVar86 = uVar86 - 1 & uVar86;
      uVar88 = (ulong)(uint)((int)lVar84 << 6);
      local_6b8 = (ulong)*(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[local_6b8].ptr;
      auVar20 = *(undefined1 (*) [16])(prim + uVar88 + lVar70 + 0x16);
      if (uVar86 != 0) {
        uVar80 = uVar86 - 1 & uVar86;
        for (uVar81 = uVar86; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
        if (uVar80 != 0) {
          for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_430 = *(undefined1 (*) [16])(prim + uVar88 + lVar70 + 0x26);
      local_440 = *(undefined1 (*) [16])(prim + uVar88 + lVar70 + 0x36);
      local_450 = *(undefined1 (*) [16])(prim + uVar88 + lVar70 + 0x46);
      local_500._0_8_ = pGVar11;
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar90 = vsubps_avx512vl(auVar20,auVar93);
      uVar146 = auVar90._0_4_;
      auVar94._4_4_ = uVar146;
      auVar94._0_4_ = uVar146;
      auVar94._8_4_ = uVar146;
      auVar94._12_4_ = uVar146;
      auVar92 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar166 = pre->ray_space[k].vz.field_0.m128[0];
      fVar145 = pre->ray_space[k].vz.field_0.m128[1];
      fVar171 = pre->ray_space[k].vz.field_0.m128[2];
      fVar172 = pre->ray_space[k].vz.field_0.m128[3];
      auVar96._0_4_ = fVar166 * auVar90._0_4_;
      auVar96._4_4_ = fVar145 * auVar90._4_4_;
      auVar96._8_4_ = fVar171 * auVar90._8_4_;
      auVar96._12_4_ = fVar172 * auVar90._12_4_;
      auVar92 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar92);
      auVar5 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar3,auVar94);
      auVar91 = vshufps_avx512vl(auVar20,auVar20,0xff);
      auVar90 = vsubps_avx(local_430,auVar93);
      uVar146 = auVar90._0_4_;
      auVar159._4_4_ = uVar146;
      auVar159._0_4_ = uVar146;
      auVar159._8_4_ = uVar146;
      auVar159._12_4_ = uVar146;
      auVar92 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar183._0_4_ = fVar166 * auVar90._0_4_;
      auVar183._4_4_ = fVar145 * auVar90._4_4_;
      auVar183._8_4_ = fVar171 * auVar90._8_4_;
      auVar183._12_4_ = fVar172 * auVar90._12_4_;
      auVar92 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar4,auVar92);
      auVar6 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar3,auVar159);
      auVar90 = vsubps_avx512vl(local_440,auVar93);
      uVar146 = auVar90._0_4_;
      auVar160._4_4_ = uVar146;
      auVar160._0_4_ = uVar146;
      auVar160._8_4_ = uVar146;
      auVar160._12_4_ = uVar146;
      auVar92 = vshufps_avx(auVar90,auVar90,0x55);
      auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar185._0_4_ = fVar166 * auVar90._0_4_;
      auVar185._4_4_ = fVar145 * auVar90._4_4_;
      auVar185._8_4_ = fVar171 * auVar90._8_4_;
      auVar185._12_4_ = fVar172 * auVar90._12_4_;
      auVar92 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar4,auVar92);
      auVar90 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar3,auVar160);
      auVar92 = vsubps_avx512vl(local_450,auVar93);
      uVar146 = auVar92._0_4_;
      auVar95._4_4_ = uVar146;
      auVar95._0_4_ = uVar146;
      auVar95._8_4_ = uVar146;
      auVar95._12_4_ = uVar146;
      auVar93 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar186._0_4_ = fVar166 * auVar92._0_4_;
      auVar186._4_4_ = fVar145 * auVar92._4_4_;
      auVar186._8_4_ = fVar171 * auVar92._8_4_;
      auVar186._12_4_ = fVar172 * auVar92._12_4_;
      auVar93 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar4,auVar93);
      auVar7 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar3,auVar95);
      lVar69 = (long)iVar10 * 0x44;
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar69);
      uVar146 = auVar5._0_4_;
      local_480._4_4_ = uVar146;
      local_480._0_4_ = uVar146;
      local_480._8_4_ = uVar146;
      local_480._12_4_ = uVar146;
      local_480._16_4_ = uVar146;
      local_480._20_4_ = uVar146;
      local_480._24_4_ = uVar146;
      local_480._28_4_ = uVar146;
      auVar155._8_4_ = 1;
      auVar155._0_8_ = 0x100000001;
      auVar155._12_4_ = 1;
      auVar155._16_4_ = 1;
      auVar155._20_4_ = 1;
      auVar155._24_4_ = 1;
      auVar155._28_4_ = 1;
      local_4a0 = vpermps_avx512vl(auVar155,ZEXT1632(auVar5));
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x484);
      local_5e0 = vbroadcastss_avx512vl(auVar6);
      local_1e0 = vpermps_avx2(auVar155,ZEXT1632(auVar6));
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar90);
      local_c0 = vpermps_avx512vl(auVar155,ZEXT1632(auVar90));
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0xd8c);
      local_520 = vbroadcastss_avx512vl(auVar7);
      auVar198 = ZEXT3264(local_520);
      local_540 = vpermps_avx512vl(auVar155,ZEXT1632(auVar7));
      auVar106 = vmulps_avx512vl(local_520,auVar113);
      auVar107 = vmulps_avx512vl(local_540,auVar113);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_5e0);
      auVar93 = vfmadd231ps_fma(auVar107,auVar115,local_1e0);
      auVar102 = vfmadd231ps_avx512vl(auVar106,auVar104,local_480);
      auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar104,local_4a0);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar69);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x484);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x908);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0xd8c);
      auVar101 = vmulps_avx512vl(local_520,auVar111);
      auVar99 = vmulps_avx512vl(local_540,auVar111);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar112,local_c0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_5e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_1e0);
      auVar8 = vfmadd231ps_fma(auVar101,auVar106,local_480);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_4a0);
      local_600 = vsubps_avx512vl(ZEXT1632(auVar8),auVar102);
      _local_680 = vsubps_avx(auVar99,auVar108);
      auVar101 = vmulps_avx512vl(auVar108,local_600);
      auVar100 = vmulps_avx512vl(auVar102,_local_680);
      auVar101 = vsubps_avx512vl(auVar101,auVar100);
      auVar93 = vshufps_avx(local_430,local_430,0xff);
      uVar147 = auVar91._0_8_;
      local_e0._8_8_ = uVar147;
      local_e0._0_8_ = uVar147;
      local_e0._16_8_ = uVar147;
      local_e0._24_8_ = uVar147;
      local_100 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_440,local_440,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar93);
      auVar93 = vshufps_avx512vl(local_450,local_450,0xff);
      uVar147 = auVar93._0_8_;
      register0x00001248 = uVar147;
      local_140 = uVar147;
      register0x00001250 = uVar147;
      register0x00001258 = uVar147;
      auVar100 = vmulps_avx512vl(_local_140,auVar113);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar114,local_120);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,local_100);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_e0);
      auVar109 = vmulps_avx512vl(_local_140,auVar111);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_120);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,local_100);
      auVar91 = vfmadd231ps_fma(auVar109,auVar106,local_e0);
      auVar109 = vmulps_avx512vl(_local_680,_local_680);
      auVar109 = vfmadd231ps_avx512vl(auVar109,local_600,local_600);
      auVar110 = vmaxps_avx512vl(auVar100,ZEXT1632(auVar91));
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      auVar109 = vmulps_avx512vl(auVar110,auVar109);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar147 = vcmpps_avx512vl(auVar101,auVar109,2);
      auVar93 = vblendps_avx(auVar5,auVar20,8);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar92 = vandps_avx512vl(auVar93,auVar94);
      auVar93 = vblendps_avx(auVar6,local_430,8);
      auVar93 = vandps_avx512vl(auVar93,auVar94);
      auVar92 = vmaxps_avx(auVar92,auVar93);
      auVar93 = vblendps_avx(auVar90,local_440,8);
      auVar95 = vandps_avx512vl(auVar93,auVar94);
      auVar93 = vblendps_avx(auVar7,local_450,8);
      auVar93 = vandps_avx512vl(auVar93,auVar94);
      auVar93 = vmaxps_avx(auVar95,auVar93);
      auVar93 = vmaxps_avx(auVar92,auVar93);
      auVar92 = vmovshdup_avx(auVar93);
      auVar92 = vmaxss_avx(auVar92,auVar93);
      auVar93 = vshufpd_avx(auVar93,auVar93,1);
      auVar93 = vmaxss_avx(auVar93,auVar92);
      local_610 = vcvtsi2ss_avx512f(local_450,iVar10);
      auVar187._0_4_ = local_610._0_4_;
      auVar187._4_4_ = auVar187._0_4_;
      auVar187._8_4_ = auVar187._0_4_;
      auVar187._12_4_ = auVar187._0_4_;
      auVar187._16_4_ = auVar187._0_4_;
      auVar187._20_4_ = auVar187._0_4_;
      auVar187._24_4_ = auVar187._0_4_;
      auVar187._28_4_ = auVar187._0_4_;
      uVar21 = vcmpps_avx512vl(auVar187,_DAT_02020f40,0xe);
      local_290 = (byte)uVar147 & (byte)uVar21;
      local_560 = auVar93._0_4_ * 4.7683716e-07;
      auVar163._8_4_ = 2;
      auVar163._0_8_ = 0x200000002;
      auVar163._12_4_ = 2;
      auVar163._16_4_ = 2;
      auVar163._20_4_ = 2;
      auVar163._24_4_ = 2;
      auVar163._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar163,ZEXT1632(auVar5));
      local_180 = vpermps_avx512vl(auVar163,ZEXT1632(auVar6));
      local_1a0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar90));
      auVar101 = vpermps_avx2(auVar163,ZEXT1632(auVar7));
      fVar166 = *(float *)(ray + k * 4 + 0x30);
      local_660 = ZEXT416((uint)local_560);
      if (local_290 == 0) {
        uVar88 = 0;
        auVar93 = vxorps_avx512vl(auVar20,auVar20);
        auVar197 = ZEXT1664(auVar93);
        auVar179 = ZEXT3264(auVar103);
        in_ZMM20 = ZEXT3264(local_4c0);
        auVar156 = ZEXT3264(auVar105);
        in_ZMM21 = ZEXT3264(local_4e0);
        auVar196 = ZEXT3264(local_480);
        auVar195 = ZEXT3264(local_4a0);
        auVar194 = ZEXT3264(local_5e0);
        auVar199 = ZEXT3264(local_540);
      }
      else {
        fStack_55c = 0.0;
        fStack_558 = 0.0;
        fStack_554 = 0.0;
        auVar111 = vmulps_avx512vl(auVar101,auVar111);
        auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar112);
        auVar107 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
        auVar113 = vmulps_avx512vl(auVar101,auVar113);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1f9c);
        auVar112 = vfmadd213ps_avx512vl(auVar104,local_160,auVar112);
        auVar104 = vmulps_avx512vl(local_520,auVar106);
        auVar111 = vmulps_avx512vl(local_540,auVar106);
        auVar31._4_4_ = auVar101._4_4_ * auVar106._4_4_;
        auVar31._0_4_ = auVar101._0_4_ * auVar106._0_4_;
        auVar31._8_4_ = auVar101._8_4_ * auVar106._8_4_;
        auVar31._12_4_ = auVar101._12_4_ * auVar106._12_4_;
        auVar31._16_4_ = auVar101._16_4_ * auVar106._16_4_;
        auVar31._20_4_ = auVar101._20_4_ * auVar106._20_4_;
        auVar31._24_4_ = auVar101._24_4_ * auVar106._24_4_;
        auVar31._28_4_ = auVar106._28_4_;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
        auVar106 = vfmadd231ps_avx512vl(auVar111,auVar113,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar31,local_1a0,auVar113);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_5e0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,local_1e0);
        auVar111 = vfmadd231ps_avx512vl(auVar113,local_180,auVar114);
        auVar109 = vfmadd231ps_avx512vl(auVar104,auVar115,local_480);
        auVar195 = ZEXT3264(local_4a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_4a0);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1210);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1f9c);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_160,auVar115);
        auVar115 = vmulps_avx512vl(local_520,auVar113);
        auVar110 = vmulps_avx512vl(local_540,auVar113);
        auVar32._4_4_ = auVar101._4_4_ * auVar113._4_4_;
        auVar32._0_4_ = auVar101._0_4_ * auVar113._0_4_;
        auVar32._8_4_ = auVar101._8_4_ * auVar113._8_4_;
        auVar32._12_4_ = auVar101._12_4_ * auVar113._12_4_;
        auVar32._16_4_ = auVar101._16_4_ * auVar113._16_4_;
        auVar32._20_4_ = auVar101._20_4_ * auVar113._20_4_;
        auVar32._24_4_ = auVar101._24_4_ * auVar113._24_4_;
        auVar32._28_4_ = auVar113._28_4_;
        auVar113 = vfmadd231ps_avx512vl(auVar115,auVar114,local_a0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar114,local_c0);
        auVar114 = vfmadd231ps_avx512vl(auVar32,local_1a0,auVar114);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_5e0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_1e0);
        auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
        auVar114 = vfmadd231ps_avx512vl(auVar113,auVar104,local_480);
        auVar113 = vfmadd231ps_avx512vl(auVar110,auVar104,local_4a0);
        auVar110 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
        auVar192._8_4_ = 0x7fffffff;
        auVar192._0_8_ = 0x7fffffff7fffffff;
        auVar192._12_4_ = 0x7fffffff;
        auVar192._16_4_ = 0x7fffffff;
        auVar192._20_4_ = 0x7fffffff;
        auVar192._24_4_ = 0x7fffffff;
        auVar192._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar109,auVar192);
        auVar115 = vandps_avx(auVar106,auVar192);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar111,auVar192);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        auVar111 = vbroadcastss_avx512vl(local_660);
        uVar88 = vcmpps_avx512vl(auVar104,auVar111,1);
        bVar13 = (bool)((byte)uVar88 & 1);
        auVar116._0_4_ = (float)((uint)bVar13 * local_600._0_4_ | (uint)!bVar13 * auVar109._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar13 * local_600._4_4_ | (uint)!bVar13 * auVar109._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar13 * local_600._8_4_ | (uint)!bVar13 * auVar109._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar13 * local_600._12_4_ | (uint)!bVar13 * auVar109._12_4_)
        ;
        bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar13 * local_600._16_4_ | (uint)!bVar13 * auVar109._16_4_)
        ;
        bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar13 * local_600._20_4_ | (uint)!bVar13 * auVar109._20_4_)
        ;
        bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar13 * local_600._24_4_ | (uint)!bVar13 * auVar109._24_4_)
        ;
        bVar13 = SUB81(uVar88 >> 7,0);
        auVar116._28_4_ = (uint)bVar13 * local_600._28_4_ | (uint)!bVar13 * auVar109._28_4_;
        bVar13 = (bool)((byte)uVar88 & 1);
        auVar117._0_4_ = (float)((uint)bVar13 * local_680._0_4_ | (uint)!bVar13 * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar13 * local_680._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar13 * iStack_678 | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar13 * iStack_674 | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar13 * iStack_670 | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar13 * iStack_66c | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar13 * iStack_668 | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar88 >> 7,0);
        auVar117._28_4_ = (uint)bVar13 * iStack_664 | (uint)!bVar13 * auVar106._28_4_;
        auVar104 = vandps_avx(auVar192,auVar114);
        auVar115 = vandps_avx(auVar113,auVar192);
        auVar115 = vmaxps_avx(auVar104,auVar115);
        auVar104 = vandps_avx(auVar110,auVar192);
        auVar104 = vmaxps_avx(auVar115,auVar104);
        uVar88 = vcmpps_avx512vl(auVar104,auVar111,1);
        bVar13 = (bool)((byte)uVar88 & 1);
        auVar118._0_4_ = (float)((uint)bVar13 * local_600._0_4_ | (uint)!bVar13 * auVar114._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar13 * local_600._4_4_ | (uint)!bVar13 * auVar114._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar13 * local_600._8_4_ | (uint)!bVar13 * auVar114._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar13 * local_600._12_4_ | (uint)!bVar13 * auVar114._12_4_)
        ;
        bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar13 * local_600._16_4_ | (uint)!bVar13 * auVar114._16_4_)
        ;
        bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar13 * local_600._20_4_ | (uint)!bVar13 * auVar114._20_4_)
        ;
        bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar13 * local_600._24_4_ | (uint)!bVar13 * auVar114._24_4_)
        ;
        bVar13 = SUB81(uVar88 >> 7,0);
        auVar118._28_4_ = (uint)bVar13 * local_600._28_4_ | (uint)!bVar13 * auVar114._28_4_;
        bVar13 = (bool)((byte)uVar88 & 1);
        auVar119._0_4_ = (float)((uint)bVar13 * local_680._0_4_ | (uint)!bVar13 * auVar113._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * local_680._4_4_ | (uint)!bVar13 * auVar113._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * iStack_678 | (uint)!bVar13 * auVar113._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * iStack_674 | (uint)!bVar13 * auVar113._12_4_);
        bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar13 * iStack_670 | (uint)!bVar13 * auVar113._16_4_);
        bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar13 * iStack_66c | (uint)!bVar13 * auVar113._20_4_);
        bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar13 * iStack_668 | (uint)!bVar13 * auVar113._24_4_);
        bVar13 = SUB81(uVar88 >> 7,0);
        auVar119._28_4_ = (uint)bVar13 * iStack_664 | (uint)!bVar13 * auVar113._28_4_;
        auVar96 = vxorps_avx512vl(auVar20,auVar20);
        auVar197 = ZEXT1664(auVar96);
        auVar104 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar96));
        auVar93 = vfmadd231ps_fma(auVar104,auVar117,auVar117);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar145 = auVar104._0_4_;
        fVar171 = auVar104._4_4_;
        fVar172 = auVar104._8_4_;
        fVar173 = auVar104._12_4_;
        fVar158 = auVar104._16_4_;
        fVar165 = auVar104._20_4_;
        fVar89 = auVar104._24_4_;
        auVar33._4_4_ = fVar171 * fVar171 * fVar171 * auVar93._4_4_ * -0.5;
        auVar33._0_4_ = fVar145 * fVar145 * fVar145 * auVar93._0_4_ * -0.5;
        auVar33._8_4_ = fVar172 * fVar172 * fVar172 * auVar93._8_4_ * -0.5;
        auVar33._12_4_ = fVar173 * fVar173 * fVar173 * auVar93._12_4_ * -0.5;
        auVar33._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar33._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar33._24_4_ = fVar89 * fVar89 * fVar89 * -0.0;
        auVar33._28_4_ = 0;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar114 = vfmadd231ps_avx512vl(auVar33,auVar115,auVar104);
        auVar34._4_4_ = auVar117._4_4_ * auVar114._4_4_;
        auVar34._0_4_ = auVar117._0_4_ * auVar114._0_4_;
        auVar34._8_4_ = auVar117._8_4_ * auVar114._8_4_;
        auVar34._12_4_ = auVar117._12_4_ * auVar114._12_4_;
        auVar34._16_4_ = auVar117._16_4_ * auVar114._16_4_;
        auVar34._20_4_ = auVar117._20_4_ * auVar114._20_4_;
        auVar34._24_4_ = auVar117._24_4_ * auVar114._24_4_;
        auVar34._28_4_ = auVar104._28_4_;
        auVar35._4_4_ = auVar114._4_4_ * -auVar116._4_4_;
        auVar35._0_4_ = auVar114._0_4_ * -auVar116._0_4_;
        auVar35._8_4_ = auVar114._8_4_ * -auVar116._8_4_;
        auVar35._12_4_ = auVar114._12_4_ * -auVar116._12_4_;
        auVar35._16_4_ = auVar114._16_4_ * -auVar116._16_4_;
        auVar35._20_4_ = auVar114._20_4_ * -auVar116._20_4_;
        auVar35._24_4_ = auVar114._24_4_ * -auVar116._24_4_;
        auVar35._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar114,ZEXT1632(auVar96));
        auVar109 = ZEXT1632(auVar96);
        auVar113 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar109);
        auVar93 = vfmadd231ps_fma(auVar113,auVar119,auVar119);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar93));
        fVar145 = auVar113._0_4_;
        fVar171 = auVar113._4_4_;
        fVar172 = auVar113._8_4_;
        fVar173 = auVar113._12_4_;
        fVar158 = auVar113._16_4_;
        fVar165 = auVar113._20_4_;
        fVar89 = auVar113._24_4_;
        auVar36._4_4_ = fVar171 * fVar171 * fVar171 * auVar93._4_4_ * -0.5;
        auVar36._0_4_ = fVar145 * fVar145 * fVar145 * auVar93._0_4_ * -0.5;
        auVar36._8_4_ = fVar172 * fVar172 * fVar172 * auVar93._8_4_ * -0.5;
        auVar36._12_4_ = fVar173 * fVar173 * fVar173 * auVar93._12_4_ * -0.5;
        auVar36._16_4_ = fVar158 * fVar158 * fVar158 * -0.0;
        auVar36._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar36._24_4_ = fVar89 * fVar89 * fVar89 * -0.0;
        auVar36._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar36,auVar115,auVar113);
        auVar37._4_4_ = auVar119._4_4_ * auVar115._4_4_;
        auVar37._0_4_ = auVar119._0_4_ * auVar115._0_4_;
        auVar37._8_4_ = auVar119._8_4_ * auVar115._8_4_;
        auVar37._12_4_ = auVar119._12_4_ * auVar115._12_4_;
        auVar37._16_4_ = auVar119._16_4_ * auVar115._16_4_;
        auVar37._20_4_ = auVar119._20_4_ * auVar115._20_4_;
        auVar37._24_4_ = auVar119._24_4_ * auVar115._24_4_;
        auVar37._28_4_ = auVar113._28_4_;
        auVar38._4_4_ = -auVar118._4_4_ * auVar115._4_4_;
        auVar38._0_4_ = -auVar118._0_4_ * auVar115._0_4_;
        auVar38._8_4_ = -auVar118._8_4_ * auVar115._8_4_;
        auVar38._12_4_ = -auVar118._12_4_ * auVar115._12_4_;
        auVar38._16_4_ = -auVar118._16_4_ * auVar115._16_4_;
        auVar38._20_4_ = -auVar118._20_4_ * auVar115._20_4_;
        auVar38._24_4_ = -auVar118._24_4_ * auVar115._24_4_;
        auVar38._28_4_ = auVar114._28_4_;
        auVar115 = vmulps_avx512vl(auVar115,auVar109);
        auVar93 = vfmadd213ps_fma(auVar34,auVar100,auVar102);
        auVar92 = vfmadd213ps_fma(auVar35,auVar100,auVar108);
        auVar114 = vfmadd213ps_avx512vl(auVar104,auVar100,auVar112);
        auVar113 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar91),ZEXT1632(auVar8));
        auVar94 = vfnmadd213ps_fma(auVar34,auVar100,auVar102);
        auVar111 = ZEXT1632(auVar91);
        auVar90 = vfmadd213ps_fma(auVar38,auVar111,auVar99);
        auVar95 = vfnmadd213ps_fma(auVar35,auVar100,auVar108);
        auVar5 = vfmadd213ps_fma(auVar115,auVar111,auVar107);
        auVar106 = vfnmadd231ps_avx512vl(auVar112,auVar100,auVar104);
        auVar8 = vfnmadd213ps_fma(auVar37,auVar111,ZEXT1632(auVar8));
        auVar159 = vfnmadd213ps_fma(auVar38,auVar111,auVar99);
        auVar160 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar91),auVar115);
        auVar115 = vsubps_avx512vl(auVar113,ZEXT1632(auVar94));
        auVar104 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar95));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar5),auVar106);
        auVar112 = vmulps_avx512vl(auVar104,auVar106);
        auVar6 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar95),auVar107);
        auVar39._4_4_ = auVar94._4_4_ * auVar107._4_4_;
        auVar39._0_4_ = auVar94._0_4_ * auVar107._0_4_;
        auVar39._8_4_ = auVar94._8_4_ * auVar107._8_4_;
        auVar39._12_4_ = auVar94._12_4_ * auVar107._12_4_;
        auVar39._16_4_ = auVar107._16_4_ * 0.0;
        auVar39._20_4_ = auVar107._20_4_ * 0.0;
        auVar39._24_4_ = auVar107._24_4_ * 0.0;
        auVar39._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar39,auVar106,auVar115);
        auVar40._4_4_ = auVar95._4_4_ * auVar115._4_4_;
        auVar40._0_4_ = auVar95._0_4_ * auVar115._0_4_;
        auVar40._8_4_ = auVar95._8_4_ * auVar115._8_4_;
        auVar40._12_4_ = auVar95._12_4_ * auVar115._12_4_;
        auVar40._16_4_ = auVar115._16_4_ * 0.0;
        auVar40._20_4_ = auVar115._20_4_ * 0.0;
        auVar40._24_4_ = auVar115._24_4_ * 0.0;
        auVar40._28_4_ = auVar115._28_4_;
        auVar7 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar94),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar109,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar6));
        auVar109 = ZEXT1632(auVar96);
        uVar88 = vcmpps_avx512vl(auVar104,auVar109,2);
        bVar82 = (byte)uVar88;
        fVar89 = (float)((uint)(bVar82 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar8._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar137 = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar8._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar139 = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar8._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar141 = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar8._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar89))));
        fVar157 = (float)((uint)(bVar82 & 1) * auVar92._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * auVar159._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar138 = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar159._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar140 = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar159._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar142 = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar159._12_4_);
        auVar111 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar140,CONCAT44(fVar138,fVar157))));
        auVar120._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar160._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar160._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar160._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar160._12_4_);
        fVar145 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar114._16_4_);
        auVar120._16_4_ = fVar145;
        fVar171 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar114._20_4_);
        auVar120._20_4_ = fVar171;
        fVar172 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar114._24_4_);
        auVar120._24_4_ = fVar172;
        iVar1 = (uint)(byte)(uVar88 >> 7) * auVar114._28_4_;
        auVar120._28_4_ = iVar1;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar94),auVar113);
        auVar121._0_4_ =
             (uint)(bVar82 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar6._0_4_;
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar6._4_4_;
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar6._8_4_;
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar6._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar90));
        auVar122._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar92._0_4_
                    );
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar92._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar92._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar92._12_4_);
        fVar173 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_);
        auVar122._16_4_ = fVar173;
        fVar158 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_);
        auVar122._20_4_ = fVar158;
        fVar165 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_);
        auVar122._24_4_ = fVar165;
        auVar122._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar115._28_4_;
        auVar115 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar5));
        auVar123._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar114._0_4_);
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar114._4_4_);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar114._8_4_);
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar114._12_4_);
        bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar13 * auVar115._16_4_ | (uint)!bVar13 * auVar114._16_4_);
        bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar13 * auVar115._20_4_ | (uint)!bVar13 * auVar114._20_4_);
        bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar13 * auVar115._24_4_ | (uint)!bVar13 * auVar114._24_4_);
        bVar13 = SUB81(uVar88 >> 7,0);
        auVar123._28_4_ = (uint)bVar13 * auVar115._28_4_ | (uint)!bVar13 * auVar114._28_4_;
        auVar124._0_4_ =
             (uint)(bVar82 & 1) * (int)auVar94._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar113._0_4_;
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar13 * (int)auVar94._4_4_ | (uint)!bVar13 * auVar113._4_4_;
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar13 * (int)auVar94._8_4_ | (uint)!bVar13 * auVar113._8_4_;
        bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar13 * (int)auVar94._12_4_ | (uint)!bVar13 * auVar113._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar113._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar113._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar113._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar113._28_4_;
        bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar82 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar5._0_4_;
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar5._4_4_;
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar5._8_4_;
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar5._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar106._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar106._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar106._24_4_;
        iVar2 = (uint)(byte)(uVar88 >> 7) * auVar106._28_4_;
        auVar125._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar124,auVar112);
        auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar95._12_4_ |
                                                 (uint)!bVar16 * auVar90._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar95._8_4_ |
                                                          (uint)!bVar15 * auVar90._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar95._4_4_
                                                                   | (uint)!bVar13 * auVar90._4_4_,
                                                                   (uint)(bVar82 & 1) *
                                                                   (int)auVar95._0_4_ |
                                                                   (uint)!(bool)(bVar82 & 1) *
                                                                   auVar90._0_4_)))),auVar111);
        auVar114 = vsubps_avx(auVar125,auVar120);
        auVar113 = vsubps_avx(auVar112,auVar121);
        auVar106 = vsubps_avx(auVar111,auVar122);
        auVar107 = vsubps_avx(auVar120,auVar123);
        auVar41._4_4_ = auVar114._4_4_ * fVar137;
        auVar41._0_4_ = auVar114._0_4_ * fVar89;
        auVar41._8_4_ = auVar114._8_4_ * fVar139;
        auVar41._12_4_ = auVar114._12_4_ * fVar141;
        auVar41._16_4_ = auVar114._16_4_ * 0.0;
        auVar41._20_4_ = auVar114._20_4_ * 0.0;
        auVar41._24_4_ = auVar114._24_4_ * 0.0;
        auVar41._28_4_ = iVar2;
        auVar93 = vfmsub231ps_fma(auVar41,auVar120,auVar102);
        auVar42._4_4_ = fVar138 * auVar102._4_4_;
        auVar42._0_4_ = fVar157 * auVar102._0_4_;
        auVar42._8_4_ = fVar140 * auVar102._8_4_;
        auVar42._12_4_ = fVar142 * auVar102._12_4_;
        auVar42._16_4_ = auVar102._16_4_ * 0.0;
        auVar42._20_4_ = auVar102._20_4_ * 0.0;
        auVar42._24_4_ = auVar102._24_4_ * 0.0;
        auVar42._28_4_ = auVar104._28_4_;
        auVar92 = vfmsub231ps_fma(auVar42,auVar112,auVar115);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar109,ZEXT1632(auVar93));
        auVar167._0_4_ = auVar115._0_4_ * auVar120._0_4_;
        auVar167._4_4_ = auVar115._4_4_ * auVar120._4_4_;
        auVar167._8_4_ = auVar115._8_4_ * auVar120._8_4_;
        auVar167._12_4_ = auVar115._12_4_ * auVar120._12_4_;
        auVar167._16_4_ = auVar115._16_4_ * fVar145;
        auVar167._20_4_ = auVar115._20_4_ * fVar171;
        auVar167._24_4_ = auVar115._24_4_ * fVar172;
        auVar167._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar167,auVar111,auVar114);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar93));
        auVar104 = vmulps_avx512vl(auVar107,auVar121);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar123);
        auVar43._4_4_ = auVar106._4_4_ * auVar123._4_4_;
        auVar43._0_4_ = auVar106._0_4_ * auVar123._0_4_;
        auVar43._8_4_ = auVar106._8_4_ * auVar123._8_4_;
        auVar43._12_4_ = auVar106._12_4_ * auVar123._12_4_;
        auVar43._16_4_ = auVar106._16_4_ * auVar123._16_4_;
        auVar43._20_4_ = auVar106._20_4_ * auVar123._20_4_;
        auVar43._24_4_ = auVar106._24_4_ * auVar123._24_4_;
        auVar43._28_4_ = auVar123._28_4_;
        auVar93 = vfmsub231ps_fma(auVar43,auVar122,auVar107);
        auVar168._0_4_ = auVar122._0_4_ * auVar113._0_4_;
        auVar168._4_4_ = auVar122._4_4_ * auVar113._4_4_;
        auVar168._8_4_ = auVar122._8_4_ * auVar113._8_4_;
        auVar168._12_4_ = auVar122._12_4_ * auVar113._12_4_;
        auVar168._16_4_ = fVar173 * auVar113._16_4_;
        auVar168._20_4_ = fVar158 * auVar113._20_4_;
        auVar168._24_4_ = fVar165 * auVar113._24_4_;
        auVar168._28_4_ = 0;
        auVar92 = vfmsub231ps_fma(auVar168,auVar106,auVar121);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar109,auVar104);
        auVar99 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar93));
        auVar104 = vmaxps_avx(auVar108,auVar99);
        uVar147 = vcmpps_avx512vl(auVar104,auVar109,2);
        local_290 = local_290 & (byte)uVar147;
        in_ZMM20 = ZEXT3264(local_4c0);
        in_ZMM21 = ZEXT3264(local_4e0);
        auVar196 = ZEXT3264(local_480);
        auVar194 = ZEXT3264(local_5e0);
        auVar190 = ZEXT1664(local_660);
        if (local_290 == 0) {
          local_290 = 0;
          auVar179 = ZEXT3264(auVar103);
          auVar156 = ZEXT3264(auVar105);
        }
        else {
          auVar44._4_4_ = auVar107._4_4_ * auVar115._4_4_;
          auVar44._0_4_ = auVar107._0_4_ * auVar115._0_4_;
          auVar44._8_4_ = auVar107._8_4_ * auVar115._8_4_;
          auVar44._12_4_ = auVar107._12_4_ * auVar115._12_4_;
          auVar44._16_4_ = auVar107._16_4_ * auVar115._16_4_;
          auVar44._20_4_ = auVar107._20_4_ * auVar115._20_4_;
          auVar44._24_4_ = auVar107._24_4_ * auVar115._24_4_;
          auVar44._28_4_ = auVar104._28_4_;
          auVar90 = vfmsub231ps_fma(auVar44,auVar106,auVar114);
          auVar45._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar45._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar45._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar45._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar45._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar45._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar45._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar45._28_4_ = auVar114._28_4_;
          auVar92 = vfmsub231ps_fma(auVar45,auVar102,auVar107);
          auVar46._4_4_ = auVar106._4_4_ * auVar102._4_4_;
          auVar46._0_4_ = auVar106._0_4_ * auVar102._0_4_;
          auVar46._8_4_ = auVar106._8_4_ * auVar102._8_4_;
          auVar46._12_4_ = auVar106._12_4_ * auVar102._12_4_;
          auVar46._16_4_ = auVar106._16_4_ * auVar102._16_4_;
          auVar46._20_4_ = auVar106._20_4_ * auVar102._20_4_;
          auVar46._24_4_ = auVar106._24_4_ * auVar102._24_4_;
          auVar46._28_4_ = auVar106._28_4_;
          auVar5 = vfmsub231ps_fma(auVar46,auVar113,auVar115);
          auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar5));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar90),auVar109);
          auVar115 = vrcp14ps_avx512vl(auVar104);
          auVar22._8_4_ = 0x3f800000;
          auVar22._0_8_ = &DAT_3f8000003f800000;
          auVar22._12_4_ = 0x3f800000;
          auVar22._16_4_ = 0x3f800000;
          auVar22._20_4_ = 0x3f800000;
          auVar22._24_4_ = 0x3f800000;
          auVar22._28_4_ = 0x3f800000;
          auVar114 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar22);
          auVar93 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
          auVar47._4_4_ = auVar5._4_4_ * auVar120._4_4_;
          auVar47._0_4_ = auVar5._0_4_ * auVar120._0_4_;
          auVar47._8_4_ = auVar5._8_4_ * auVar120._8_4_;
          auVar47._12_4_ = auVar5._12_4_ * auVar120._12_4_;
          auVar47._16_4_ = fVar145 * 0.0;
          auVar47._20_4_ = fVar171 * 0.0;
          auVar47._24_4_ = fVar172 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar92 = vfmadd231ps_fma(auVar47,auVar111,ZEXT1632(auVar92));
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar112,ZEXT1632(auVar90));
          fVar145 = auVar93._0_4_;
          fVar171 = auVar93._4_4_;
          fVar172 = auVar93._8_4_;
          fVar173 = auVar93._12_4_;
          auVar115 = ZEXT1632(CONCAT412(auVar92._12_4_ * fVar173,
                                        CONCAT48(auVar92._8_4_ * fVar172,
                                                 CONCAT44(auVar92._4_4_ * fVar171,
                                                          auVar92._0_4_ * fVar145))));
          auVar156 = ZEXT3264(auVar115);
          auVar181._4_4_ = fVar166;
          auVar181._0_4_ = fVar166;
          auVar181._8_4_ = fVar166;
          auVar181._12_4_ = fVar166;
          auVar181._16_4_ = fVar166;
          auVar181._20_4_ = fVar166;
          auVar181._24_4_ = fVar166;
          auVar181._28_4_ = fVar166;
          uVar147 = vcmpps_avx512vl(auVar181,auVar115,2);
          uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar23._4_4_ = uVar146;
          auVar23._0_4_ = uVar146;
          auVar23._8_4_ = uVar146;
          auVar23._12_4_ = uVar146;
          auVar23._16_4_ = uVar146;
          auVar23._20_4_ = uVar146;
          auVar23._24_4_ = uVar146;
          auVar23._28_4_ = uVar146;
          uVar21 = vcmpps_avx512vl(auVar115,auVar23,2);
          local_290 = (byte)uVar147 & (byte)uVar21 & local_290;
          if (local_290 == 0) {
            local_290 = 0;
            auVar179 = ZEXT3264(auVar103);
            auVar156 = ZEXT3264(auVar105);
          }
          else {
            uVar147 = vcmpps_avx512vl(auVar104,auVar109,4);
            if ((local_290 & (byte)uVar147) == 0) {
              local_290 = 0;
              auVar179 = ZEXT3264(auVar103);
              auVar156 = ZEXT3264(auVar105);
            }
            else {
              local_290 = local_290 & (byte)uVar147;
              fVar158 = auVar108._0_4_ * fVar145;
              fVar165 = auVar108._4_4_ * fVar171;
              auVar48._4_4_ = fVar165;
              auVar48._0_4_ = fVar158;
              fVar89 = auVar108._8_4_ * fVar172;
              auVar48._8_4_ = fVar89;
              fVar157 = auVar108._12_4_ * fVar173;
              auVar48._12_4_ = fVar157;
              fVar137 = auVar108._16_4_ * 0.0;
              auVar48._16_4_ = fVar137;
              fVar138 = auVar108._20_4_ * 0.0;
              auVar48._20_4_ = fVar138;
              fVar139 = auVar108._24_4_ * 0.0;
              auVar48._24_4_ = fVar139;
              auVar48._28_4_ = auVar108._28_4_;
              fVar145 = auVar99._0_4_ * fVar145;
              fVar171 = auVar99._4_4_ * fVar171;
              auVar49._4_4_ = fVar171;
              auVar49._0_4_ = fVar145;
              fVar172 = auVar99._8_4_ * fVar172;
              auVar49._8_4_ = fVar172;
              fVar173 = auVar99._12_4_ * fVar173;
              auVar49._12_4_ = fVar173;
              fVar140 = auVar99._16_4_ * 0.0;
              auVar49._16_4_ = fVar140;
              fVar141 = auVar99._20_4_ * 0.0;
              auVar49._20_4_ = fVar141;
              fVar142 = auVar99._24_4_ * 0.0;
              auVar49._24_4_ = fVar142;
              auVar49._28_4_ = auVar99._28_4_;
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = &DAT_3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar176,auVar48);
              bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar88 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar88 >> 6) & 1);
              bVar19 = SUB81(uVar88 >> 7,0);
              auVar179 = ZEXT3264(CONCAT428((uint)bVar19 * auVar108._28_4_ |
                                            (uint)!bVar19 * auVar105._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar139 |
                                                      (uint)!bVar18 * auVar105._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar138 |
                                                                (uint)!bVar17 * auVar105._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar137 |
                                                                          (uint)!bVar16 *
                                                                          auVar105._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar157 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar105._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar89 |
                                                  (uint)!bVar14 * auVar105._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar165 |
                                                           (uint)!bVar13 * auVar105._4_4_,
                                                           (uint)(bVar82 & 1) * (int)fVar158 |
                                                           (uint)!(bool)(bVar82 & 1) *
                                                           auVar105._0_4_))))))));
              auVar105 = vsubps_avx(auVar176,auVar49);
              bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar88 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar88 >> 6) & 1);
              bVar19 = SUB81(uVar88 >> 7,0);
              local_200._4_4_ = (uint)bVar13 * (int)fVar171 | (uint)!bVar13 * auVar105._4_4_;
              local_200._0_4_ =
                   (uint)(bVar82 & 1) * (int)fVar145 | (uint)!(bool)(bVar82 & 1) * auVar105._0_4_;
              local_200._8_4_ = (uint)bVar14 * (int)fVar172 | (uint)!bVar14 * auVar105._8_4_;
              local_200._12_4_ = (uint)bVar15 * (int)fVar173 | (uint)!bVar15 * auVar105._12_4_;
              local_200._16_4_ = (uint)bVar16 * (int)fVar140 | (uint)!bVar16 * auVar105._16_4_;
              local_200._20_4_ = (uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar105._20_4_;
              local_200._24_4_ = (uint)bVar18 * (int)fVar142 | (uint)!bVar18 * auVar105._24_4_;
              local_200._28_4_ = (uint)bVar19 * auVar99._28_4_ | (uint)!bVar19 * auVar105._28_4_;
            }
          }
        }
        auVar199 = ZEXT3264(local_540);
        auVar198 = ZEXT3264(local_520);
        auVar182 = ZEXT3264(auVar101);
        if (local_290 == 0) {
          uVar88 = 0;
        }
        else {
          auVar105 = vsubps_avx(ZEXT1632(auVar91),auVar100);
          auVar104 = auVar179._0_32_;
          auVar93 = vfmadd213ps_fma(auVar105,auVar104,auVar100);
          uVar146 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
          auVar24._4_4_ = uVar146;
          auVar24._0_4_ = uVar146;
          auVar24._8_4_ = uVar146;
          auVar24._12_4_ = uVar146;
          auVar24._16_4_ = uVar146;
          auVar24._20_4_ = uVar146;
          auVar24._24_4_ = uVar146;
          auVar24._28_4_ = uVar146;
          auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar93._12_4_ + auVar93._12_4_,
                                                        CONCAT48(auVar93._8_4_ + auVar93._8_4_,
                                                                 CONCAT44(auVar93._4_4_ +
                                                                          auVar93._4_4_,
                                                                          auVar93._0_4_ +
                                                                          auVar93._0_4_)))),auVar24)
          ;
          auVar103 = auVar156._0_32_;
          uVar147 = vcmpps_avx512vl(auVar103,auVar105,6);
          local_290 = local_290 & (byte)uVar147;
          if (local_290 == 0) {
            uVar88 = 0;
          }
          else {
            local_680._0_4_ = *(undefined4 *)(prim + lVar84 * 4 + 6);
            auVar152._8_4_ = 0xbf800000;
            auVar152._0_8_ = 0xbf800000bf800000;
            auVar152._12_4_ = 0xbf800000;
            auVar152._16_4_ = 0xbf800000;
            auVar152._20_4_ = 0xbf800000;
            auVar152._24_4_ = 0xbf800000;
            auVar152._28_4_ = 0xbf800000;
            auVar25._8_4_ = 0x40000000;
            auVar25._0_8_ = 0x4000000040000000;
            auVar25._12_4_ = 0x40000000;
            auVar25._16_4_ = 0x40000000;
            auVar25._20_4_ = 0x40000000;
            auVar25._24_4_ = 0x40000000;
            auVar25._28_4_ = 0x40000000;
            local_320 = vfmadd132ps_avx512vl(local_200,auVar152,auVar25);
            local_200 = local_320;
            auVar105 = local_200;
            local_2e0 = 0;
            local_2c0 = local_430._0_8_;
            uStack_2b8 = local_430._8_8_;
            local_2b0 = local_440._0_8_;
            uStack_2a8 = local_440._8_8_;
            local_2a0 = local_450._0_8_;
            uStack_298 = local_450._8_8_;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar88 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar88 = CONCAT71((int7)((ulong)pGVar11 >> 8),1),
                    pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar145 = 1.0 / auVar187._0_4_;
              local_280[0] = fVar145 * (auVar179._0_4_ + 0.0);
              local_280[1] = fVar145 * (auVar179._4_4_ + 1.0);
              local_280[2] = fVar145 * (auVar179._8_4_ + 2.0);
              local_280[3] = fVar145 * (auVar179._12_4_ + 3.0);
              fStack_270 = fVar145 * (auVar179._16_4_ + 4.0);
              fStack_26c = fVar145 * (auVar179._20_4_ + 5.0);
              fStack_268 = fVar145 * (auVar179._24_4_ + 6.0);
              fStack_264 = auVar179._28_4_ + 7.0;
              local_200._0_8_ = local_320._0_8_;
              local_200._8_8_ = local_320._8_8_;
              local_200._16_8_ = local_320._16_8_;
              local_200._24_8_ = local_320._24_8_;
              local_260 = local_200._0_8_;
              uStack_258 = local_200._8_8_;
              uStack_250 = local_200._16_8_;
              uStack_248 = local_200._24_8_;
              local_240 = auVar103;
              lVar84 = 0;
              uVar81 = (ulong)local_290;
              for (uVar88 = uVar81; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
                lVar84 = lVar84 + 1;
              }
              local_620 = vpbroadcastd_avx512vl();
              local_640 = vpbroadcastd_avx512vl();
              local_650 = local_440._0_4_;
              uStack_64c = local_440._4_4_;
              uStack_648 = local_440._8_8_;
              local_590 = local_450._0_4_;
              fStack_58c = local_450._4_4_;
              fStack_588 = local_450._8_4_;
              fStack_584 = local_450._12_4_;
              uVar88 = CONCAT71((int7)((ulong)lVar84 >> 8),1);
              local_630 = local_430;
              local_5c0 = auVar101;
              local_560 = fVar166;
              local_340 = auVar104;
              local_300 = auVar103;
              local_2dc = iVar10;
              local_2d0 = auVar20;
              local_200 = auVar105;
              do {
                auVar90 = auVar197._0_16_;
                local_400 = (undefined4)uVar81;
                uStack_3fc = (undefined4)(uVar81 >> 0x20);
                local_600._0_4_ = (int)uVar88;
                local_420 = *(float *)(ray + k * 4 + 0x80);
                local_3a0 = local_280[lVar84];
                local_580._0_8_ = lVar84;
                local_390 = *(undefined4 *)((long)&local_260 + lVar84 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + lVar84 * 4);
                local_6b0.context = context->user;
                fVar171 = 1.0 - local_3a0;
                fVar145 = fVar171 * fVar171 * -3.0;
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),
                                          ZEXT416((uint)(local_3a0 * fVar171)),ZEXT416(0xc0000000));
                auVar92 = vfmsub132ss_fma(ZEXT416((uint)(local_3a0 * fVar171)),
                                          ZEXT416((uint)(local_3a0 * local_3a0)),ZEXT416(0x40000000)
                                         );
                fVar171 = auVar93._0_4_ * 3.0;
                fVar172 = auVar92._0_4_ * 3.0;
                fVar173 = local_3a0 * local_3a0 * 3.0;
                auVar174._0_4_ = fVar173 * local_590;
                auVar174._4_4_ = fVar173 * fStack_58c;
                auVar174._8_4_ = fVar173 * fStack_588;
                auVar174._12_4_ = fVar173 * fStack_584;
                auVar148._4_4_ = fVar172;
                auVar148._0_4_ = fVar172;
                auVar148._8_4_ = fVar172;
                auVar148._12_4_ = fVar172;
                auVar75._4_4_ = uStack_64c;
                auVar75._0_4_ = local_650;
                auVar75._8_8_ = uStack_648;
                auVar93 = vfmadd132ps_fma(auVar148,auVar174,auVar75);
                auVar161._4_4_ = fVar171;
                auVar161._0_4_ = fVar171;
                auVar161._8_4_ = fVar171;
                auVar161._12_4_ = fVar171;
                auVar93 = vfmadd132ps_fma(auVar161,auVar93,local_630);
                auVar149._4_4_ = fVar145;
                auVar149._0_4_ = fVar145;
                auVar149._8_4_ = fVar145;
                auVar149._12_4_ = fVar145;
                auVar93 = vfmadd213ps_fma(auVar149,auVar20,auVar93);
                local_3d0 = auVar93._0_4_;
                local_3c0 = vshufps_avx(auVar93,auVar93,0x55);
                local_3b0 = vshufps_avx(auVar93,auVar93,0xaa);
                local_380 = local_640._0_8_;
                uStack_378 = local_640._8_8_;
                local_370 = local_620;
                vpcmpeqd_avx2(ZEXT1632(local_620),ZEXT1632(local_620));
                uStack_35c = (local_6b0.context)->instID[0];
                local_360 = uStack_35c;
                uStack_358 = uStack_35c;
                uStack_354 = uStack_35c;
                uStack_350 = (local_6b0.context)->instPrimID[0];
                uStack_34c = uStack_350;
                uStack_348 = uStack_350;
                uStack_344 = uStack_350;
                local_6d0 = local_460._0_8_;
                uStack_6c8 = local_460._8_8_;
                local_6b0.valid = (int *)&local_6d0;
                local_6b0.geometryUserPtr = *(void **)(local_500._0_8_ + 0x18);
                local_6b0.hit = (RTCHitN *)&local_3d0;
                local_6b0.N = 4;
                local_6b0.ray = (RTCRayN *)ray;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                fStack_39c = local_3a0;
                fStack_398 = local_3a0;
                fStack_394 = local_3a0;
                uStack_38c = local_390;
                uStack_388 = local_390;
                uStack_384 = local_390;
                if (*(code **)(local_500._0_8_ + 0x48) != (code *)0x0) {
                  (**(code **)(local_500._0_8_ + 0x48))(&local_6b0);
                  auVar190 = ZEXT1664(local_660);
                  auVar182 = ZEXT3264(local_5c0);
                  auVar199 = ZEXT3264(local_540);
                  auVar198 = ZEXT3264(local_520);
                  auVar194 = ZEXT3264(local_5e0);
                  auVar195 = ZEXT3264(local_4a0);
                  auVar196 = ZEXT3264(local_480);
                  in_ZMM21 = ZEXT3264(local_4e0);
                  in_ZMM20 = ZEXT3264(local_4c0);
                  auVar93 = vxorps_avx512vl(auVar90,auVar90);
                  auVar197 = ZEXT1664(auVar93);
                  fVar166 = local_560;
                }
                auVar93 = auVar197._0_16_;
                auVar71._8_8_ = uStack_6c8;
                auVar71._0_8_ = local_6d0;
                uVar88 = vptestmd_avx512vl(auVar71,auVar71);
                if ((uVar88 & 0xf) == 0) {
                  uVar81 = CONCAT44(uStack_3fc,local_400);
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_500._0_8_ + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_6b0);
                    auVar190 = ZEXT1664(local_660);
                    auVar182 = ZEXT3264(local_5c0);
                    auVar199 = ZEXT3264(local_540);
                    auVar198 = ZEXT3264(local_520);
                    auVar194 = ZEXT3264(local_5e0);
                    auVar195 = ZEXT3264(local_4a0);
                    auVar196 = ZEXT3264(local_480);
                    in_ZMM21 = ZEXT3264(local_4e0);
                    in_ZMM20 = ZEXT3264(local_4c0);
                    auVar93 = vxorps_avx512vl(auVar93,auVar93);
                    auVar197 = ZEXT1664(auVar93);
                    fVar166 = local_560;
                  }
                  auVar101 = auVar182._0_32_;
                  auVar72._8_8_ = uStack_6c8;
                  auVar72._0_8_ = local_6d0;
                  auVar93 = *(undefined1 (*) [16])(local_6b0.ray + 0x80);
                  uVar88 = vptestmd_avx512vl(auVar72,auVar72);
                  uVar88 = uVar88 & 0xf;
                  auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar88 & 1);
                  auVar97._0_4_ = (uint)bVar13 * auVar92._0_4_ | (uint)!bVar13 * auVar93._0_4_;
                  bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar97._4_4_ = (uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar93._4_4_;
                  bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar97._8_4_ = (uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar93._8_4_;
                  bVar13 = SUB81(uVar88 >> 3,0);
                  auVar97._12_4_ = (uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar93._12_4_;
                  *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar97;
                  uVar81 = CONCAT44(uStack_3fc,local_400);
                  if ((byte)uVar88 != 0) {
                    uVar88 = (ulong)(uint)local_600._0_4_;
                    fVar145 = auVar190._0_4_;
                    break;
                  }
                }
                auVar101 = auVar182._0_32_;
                *(float *)(ray + k * 4 + 0x80) = local_420;
                lVar84 = 0;
                uVar81 = uVar81 ^ 1L << (local_580._0_8_ & 0x3f);
                for (uVar88 = uVar81; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000)
                {
                  lVar84 = lVar84 + 1;
                }
                uVar88 = CONCAT71((int7)((ulong)pre >> 8),uVar81 != 0);
                fVar145 = auVar190._0_4_;
              } while (uVar81 != 0);
              local_560 = fVar145;
              auVar179 = ZEXT3264(auVar104);
              auVar156 = ZEXT3264(auVar103);
              uVar88 = uVar88 & 0xffffffffffffff01;
            }
            uVar88 = uVar88 & 0xffffffff;
          }
        }
      }
      if (8 < iVar10) {
        local_500 = vpbroadcastd_avx512vl();
        local_420 = 1.0 / (float)local_610._0_4_;
        auVar79._28_4_ = 0;
        auVar79._0_28_ = stack0xfffffffffffff984;
        _local_680 = auVar79 << 0x20;
        local_610 = vpbroadcastd_avx512vl();
        local_580 = vpbroadcastd_avx512vl();
        lVar84 = 8;
        auVar103 = auVar179._0_32_;
        auVar105 = auVar156._0_32_;
        local_5c0 = auVar101;
        fStack_55c = local_560;
        fStack_558 = local_560;
        fStack_554 = local_560;
        fStack_550 = local_560;
        fStack_54c = local_560;
        fStack_548 = local_560;
        fStack_544 = local_560;
        fStack_41c = local_420;
        fStack_418 = local_420;
        fStack_414 = local_420;
        fStack_410 = local_420;
        fStack_40c = local_420;
        fStack_408 = local_420;
        fStack_404 = local_420;
        local_400 = fVar166;
        uStack_3fc = fVar166;
        uStack_3f8 = fVar166;
        uStack_3f4 = fVar166;
        uStack_3f0 = fVar166;
        uStack_3ec = fVar166;
        uStack_3e8 = fVar166;
        uStack_3e4 = fVar166;
        do {
          uVar85 = (uint)uVar88;
          local_600._0_4_ = uVar85;
          auVar104 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar21 = vpcmpd_avx512vl(auVar106,local_500,1);
          auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar84 * 4 + lVar69);
          auVar115 = *(undefined1 (*) [32])(lVar69 + 0x2227768 + lVar84 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar69 + 0x2227bec + lVar84 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar69 + 0x2228070 + lVar84 * 4);
          local_520 = auVar198._0_32_;
          auVar107 = vmulps_avx512vl(local_520,auVar113);
          local_540 = auVar199._0_32_;
          auVar112 = vmulps_avx512vl(local_540,auVar113);
          auVar50._4_4_ = auVar113._4_4_ * (float)local_140._4_4_;
          auVar50._0_4_ = auVar113._0_4_ * (float)local_140._0_4_;
          auVar50._8_4_ = auVar113._8_4_ * fStack_138;
          auVar50._12_4_ = auVar113._12_4_ * fStack_134;
          auVar50._16_4_ = auVar113._16_4_ * fStack_130;
          auVar50._20_4_ = auVar113._20_4_ * fStack_12c;
          auVar50._24_4_ = auVar113._24_4_ * fStack_128;
          auVar50._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar114,local_a0);
          auVar107 = vfmadd231ps_avx512vl(auVar112,auVar114,local_c0);
          auVar112 = vfmadd231ps_avx512vl(auVar50,auVar114,local_120);
          auVar178 = auVar194._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,auVar178);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_1e0);
          auVar93 = vfmadd231ps_fma(auVar112,auVar115,local_100);
          auVar188 = auVar196._0_32_;
          auVar108 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar188);
          auVar180 = auVar195._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar180);
          auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar84 * 4 + lVar69);
          auVar107 = *(undefined1 (*) [32])(lVar69 + 0x2229b88 + lVar84 * 4);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar104,local_e0);
          auVar112 = *(undefined1 (*) [32])(lVar69 + 0x222a00c + lVar84 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar69 + 0x222a490 + lVar84 * 4);
          auVar101 = vmulps_avx512vl(local_520,auVar111);
          auVar102 = vmulps_avx512vl(local_540,auVar111);
          auVar51._4_4_ = auVar111._4_4_ * (float)local_140._4_4_;
          auVar51._0_4_ = auVar111._0_4_ * (float)local_140._0_4_;
          auVar51._8_4_ = auVar111._8_4_ * fStack_138;
          auVar51._12_4_ = auVar111._12_4_ * fStack_134;
          auVar51._16_4_ = auVar111._16_4_ * fStack_130;
          auVar51._20_4_ = auVar111._20_4_ * fStack_12c;
          auVar51._24_4_ = auVar111._24_4_ * fStack_128;
          auVar51._28_4_ = uStack_124;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar112,local_a0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar112,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar51,auVar112,local_120);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar178);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_1e0);
          auVar92 = vfmadd231ps_fma(auVar100,auVar107,local_100);
          auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar188);
          auVar109 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar180);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar106,local_e0);
          auVar110 = vmaxps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar92));
          auVar101 = vsubps_avx(auVar100,auVar108);
          auVar102 = vsubps_avx(auVar109,auVar99);
          auVar126 = vmulps_avx512vl(auVar99,auVar101);
          auVar127 = vmulps_avx512vl(auVar108,auVar102);
          auVar126 = vsubps_avx512vl(auVar126,auVar127);
          auVar127 = vmulps_avx512vl(auVar102,auVar102);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar101,auVar101);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar127);
          auVar126 = vmulps_avx512vl(auVar126,auVar126);
          uVar147 = vcmpps_avx512vl(auVar126,auVar110,2);
          local_290 = (byte)uVar21 & (byte)uVar147;
          if (local_290 == 0) {
            auVar194 = ZEXT3264(auVar178);
LAB_01d1ee6c:
            auVar190 = ZEXT3264(auVar180);
          }
          else {
            auVar111 = vmulps_avx512vl(local_5c0,auVar111);
            auVar112 = vfmadd213ps_avx512vl(auVar112,local_1a0,auVar111);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar112);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
            auVar113 = vmulps_avx512vl(local_5c0,auVar113);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_1a0,auVar113);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_180,auVar114);
            auVar107 = vfmadd213ps_avx512vl(auVar104,local_160,auVar115);
            auVar104 = *(undefined1 (*) [32])(lVar69 + 0x22284f4 + lVar84 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar69 + 0x2228978 + lVar84 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar69 + 0x2228dfc + lVar84 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar69 + 0x2229280 + lVar84 * 4);
            auVar112 = vmulps_avx512vl(local_520,auVar113);
            auVar111 = vmulps_avx512vl(local_540,auVar113);
            auVar113 = vmulps_avx512vl(local_5c0,auVar113);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_a0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar114);
            auVar113 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar178);
            auVar112 = vfmadd231ps_avx512vl(auVar111,auVar115,local_1e0);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar104,auVar188);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,auVar180);
            auVar111 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar69 + 0x222a914 + lVar84 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar69 + 0x222b21c + lVar84 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar69 + 0x222b6a0 + lVar84 * 4);
            auVar110 = vmulps_avx512vl(local_520,auVar114);
            auVar126 = vmulps_avx512vl(local_540,auVar114);
            auVar114 = vmulps_avx512vl(local_5c0,auVar114);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_a0);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar115,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_1a0,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar69 + 0x222ad98 + lVar84 * 4);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,auVar178);
            auVar90 = vfmadd231ps_fma(auVar126,auVar115,local_1e0);
            auVar115 = vfmadd231ps_avx512vl(auVar114,local_180,auVar115);
            auVar114 = vfmadd231ps_avx512vl(auVar110,auVar104,auVar188);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar104,auVar180);
            auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar104);
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar113,auVar126);
            vandps_avx512vl(auVar112,auVar126);
            auVar104 = vmaxps_avx(auVar126,auVar126);
            vandps_avx512vl(auVar111,auVar126);
            auVar104 = vmaxps_avx(auVar104,auVar126);
            auVar77._4_4_ = fStack_55c;
            auVar77._0_4_ = local_560;
            auVar77._8_4_ = fStack_558;
            auVar77._12_4_ = fStack_554;
            auVar77._16_4_ = fStack_550;
            auVar77._20_4_ = fStack_54c;
            auVar77._24_4_ = fStack_548;
            auVar77._28_4_ = fStack_544;
            uVar88 = vcmpps_avx512vl(auVar104,auVar77,1);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar128._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar113._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar113._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar113._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar113._12_4_);
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar113._16_4_);
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar113._20_4_);
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar113._24_4_);
            bVar13 = SUB81(uVar88 >> 7,0);
            auVar128._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar113._28_4_;
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar129._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar112._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar112._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar112._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar112._12_4_);
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar112._16_4_);
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar112._20_4_);
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar112._24_4_);
            bVar13 = SUB81(uVar88 >> 7,0);
            auVar129._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar112._28_4_;
            vandps_avx512vl(auVar114,auVar126);
            vandps_avx512vl(auVar110,auVar126);
            auVar104 = vmaxps_avx(auVar129,auVar129);
            vandps_avx512vl(auVar115,auVar126);
            auVar104 = vmaxps_avx(auVar104,auVar129);
            uVar88 = vcmpps_avx512vl(auVar104,auVar77,1);
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar130._0_4_ = (uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar114._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar114._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar114._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar114._12_4_;
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar130._16_4_ = (uint)bVar13 * auVar101._16_4_ | (uint)!bVar13 * auVar114._16_4_;
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar130._20_4_ = (uint)bVar13 * auVar101._20_4_ | (uint)!bVar13 * auVar114._20_4_;
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar130._24_4_ = (uint)bVar13 * auVar101._24_4_ | (uint)!bVar13 * auVar114._24_4_;
            bVar13 = SUB81(uVar88 >> 7,0);
            auVar130._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar114._28_4_;
            bVar13 = (bool)((byte)uVar88 & 1);
            auVar131._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar110._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar110._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar110._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar110._12_4_);
            bVar13 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar110._16_4_);
            bVar13 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar110._20_4_);
            bVar13 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar110._24_4_);
            bVar13 = SUB81(uVar88 >> 7,0);
            auVar131._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar110._28_4_;
            auVar184._8_4_ = 0x80000000;
            auVar184._0_8_ = 0x8000000080000000;
            auVar184._12_4_ = 0x80000000;
            auVar184._16_4_ = 0x80000000;
            auVar184._20_4_ = 0x80000000;
            auVar184._24_4_ = 0x80000000;
            auVar184._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar130,auVar184);
            auVar110 = auVar197._0_32_;
            auVar115 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar110);
            auVar90 = vfmadd231ps_fma(auVar115,auVar129,auVar129);
            auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
            auVar193._8_4_ = 0xbf000000;
            auVar193._0_8_ = 0xbf000000bf000000;
            auVar193._12_4_ = 0xbf000000;
            auVar193._16_4_ = 0xbf000000;
            auVar193._20_4_ = 0xbf000000;
            auVar193._24_4_ = 0xbf000000;
            auVar193._28_4_ = 0xbf000000;
            fVar166 = auVar115._0_4_;
            fVar145 = auVar115._4_4_;
            fVar171 = auVar115._8_4_;
            fVar172 = auVar115._12_4_;
            fVar173 = auVar115._16_4_;
            fVar158 = auVar115._20_4_;
            fVar165 = auVar115._24_4_;
            auVar52._4_4_ = fVar145 * fVar145 * fVar145 * auVar90._4_4_ * -0.5;
            auVar52._0_4_ = fVar166 * fVar166 * fVar166 * auVar90._0_4_ * -0.5;
            auVar52._8_4_ = fVar171 * fVar171 * fVar171 * auVar90._8_4_ * -0.5;
            auVar52._12_4_ = fVar172 * fVar172 * fVar172 * auVar90._12_4_ * -0.5;
            auVar52._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar52._20_4_ = fVar158 * fVar158 * fVar158 * -0.0;
            auVar52._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar52._28_4_ = auVar129._28_4_;
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar115 = vfmadd231ps_avx512vl(auVar52,auVar114,auVar115);
            auVar53._4_4_ = auVar129._4_4_ * auVar115._4_4_;
            auVar53._0_4_ = auVar129._0_4_ * auVar115._0_4_;
            auVar53._8_4_ = auVar129._8_4_ * auVar115._8_4_;
            auVar53._12_4_ = auVar129._12_4_ * auVar115._12_4_;
            auVar53._16_4_ = auVar129._16_4_ * auVar115._16_4_;
            auVar53._20_4_ = auVar129._20_4_ * auVar115._20_4_;
            auVar53._24_4_ = auVar129._24_4_ * auVar115._24_4_;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = auVar115._4_4_ * -auVar128._4_4_;
            auVar54._0_4_ = auVar115._0_4_ * -auVar128._0_4_;
            auVar54._8_4_ = auVar115._8_4_ * -auVar128._8_4_;
            auVar54._12_4_ = auVar115._12_4_ * -auVar128._12_4_;
            auVar54._16_4_ = auVar115._16_4_ * -auVar128._16_4_;
            auVar54._20_4_ = auVar115._20_4_ * -auVar128._20_4_;
            auVar54._24_4_ = auVar115._24_4_ * -auVar128._24_4_;
            auVar54._28_4_ = auVar129._28_4_;
            auVar113 = vmulps_avx512vl(auVar115,auVar110);
            auVar115 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar110);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar131,auVar131);
            auVar112 = vrsqrt14ps_avx512vl(auVar115);
            auVar115 = vmulps_avx512vl(auVar115,auVar193);
            fVar166 = auVar112._0_4_;
            fVar145 = auVar112._4_4_;
            fVar171 = auVar112._8_4_;
            fVar172 = auVar112._12_4_;
            fVar173 = auVar112._16_4_;
            fVar158 = auVar112._20_4_;
            fVar165 = auVar112._24_4_;
            auVar55._4_4_ = fVar145 * fVar145 * fVar145 * auVar115._4_4_;
            auVar55._0_4_ = fVar166 * fVar166 * fVar166 * auVar115._0_4_;
            auVar55._8_4_ = fVar171 * fVar171 * fVar171 * auVar115._8_4_;
            auVar55._12_4_ = fVar172 * fVar172 * fVar172 * auVar115._12_4_;
            auVar55._16_4_ = fVar173 * fVar173 * fVar173 * auVar115._16_4_;
            auVar55._20_4_ = fVar158 * fVar158 * fVar158 * auVar115._20_4_;
            auVar55._24_4_ = fVar165 * fVar165 * fVar165 * auVar115._24_4_;
            auVar55._28_4_ = auVar115._28_4_;
            auVar115 = vfmadd231ps_avx512vl(auVar55,auVar114,auVar112);
            auVar56._4_4_ = auVar131._4_4_ * auVar115._4_4_;
            auVar56._0_4_ = auVar131._0_4_ * auVar115._0_4_;
            auVar56._8_4_ = auVar131._8_4_ * auVar115._8_4_;
            auVar56._12_4_ = auVar131._12_4_ * auVar115._12_4_;
            auVar56._16_4_ = auVar131._16_4_ * auVar115._16_4_;
            auVar56._20_4_ = auVar131._20_4_ * auVar115._20_4_;
            auVar56._24_4_ = auVar131._24_4_ * auVar115._24_4_;
            auVar56._28_4_ = auVar112._28_4_;
            auVar57._4_4_ = auVar115._4_4_ * auVar104._4_4_;
            auVar57._0_4_ = auVar115._0_4_ * auVar104._0_4_;
            auVar57._8_4_ = auVar115._8_4_ * auVar104._8_4_;
            auVar57._12_4_ = auVar115._12_4_ * auVar104._12_4_;
            auVar57._16_4_ = auVar115._16_4_ * auVar104._16_4_;
            auVar57._20_4_ = auVar115._20_4_ * auVar104._20_4_;
            auVar57._24_4_ = auVar115._24_4_ * auVar104._24_4_;
            auVar57._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar115,auVar110);
            auVar90 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar93),auVar108);
            auVar115 = ZEXT1632(auVar93);
            auVar5 = vfmadd213ps_fma(auVar54,auVar115,auVar99);
            auVar114 = vfmadd213ps_avx512vl(auVar113,auVar115,auVar107);
            auVar112 = vfmadd213ps_avx512vl(auVar56,ZEXT1632(auVar92),auVar100);
            auVar94 = vfnmadd213ps_fma(auVar53,auVar115,auVar108);
            auVar111 = ZEXT1632(auVar92);
            auVar6 = vfmadd213ps_fma(auVar57,auVar111,auVar109);
            auVar95 = vfnmadd213ps_fma(auVar54,auVar115,auVar99);
            auVar7 = vfmadd213ps_fma(auVar104,auVar111,auVar106);
            auVar99 = ZEXT1632(auVar93);
            auVar96 = vfnmadd231ps_fma(auVar107,auVar99,auVar113);
            auVar159 = vfnmadd213ps_fma(auVar56,auVar111,auVar100);
            auVar160 = vfnmadd213ps_fma(auVar57,auVar111,auVar109);
            auVar183 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar92),auVar104);
            auVar106 = vsubps_avx512vl(auVar112,ZEXT1632(auVar94));
            auVar104 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar95));
            auVar115 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar96));
            auVar58._4_4_ = auVar104._4_4_ * auVar96._4_4_;
            auVar58._0_4_ = auVar104._0_4_ * auVar96._0_4_;
            auVar58._8_4_ = auVar104._8_4_ * auVar96._8_4_;
            auVar58._12_4_ = auVar104._12_4_ * auVar96._12_4_;
            auVar58._16_4_ = auVar104._16_4_ * 0.0;
            auVar58._20_4_ = auVar104._20_4_ * 0.0;
            auVar58._24_4_ = auVar104._24_4_ * 0.0;
            auVar58._28_4_ = auVar113._28_4_;
            auVar93 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar95),auVar115);
            auVar59._4_4_ = auVar115._4_4_ * auVar94._4_4_;
            auVar59._0_4_ = auVar115._0_4_ * auVar94._0_4_;
            auVar59._8_4_ = auVar115._8_4_ * auVar94._8_4_;
            auVar59._12_4_ = auVar115._12_4_ * auVar94._12_4_;
            auVar59._16_4_ = auVar115._16_4_ * 0.0;
            auVar59._20_4_ = auVar115._20_4_ * 0.0;
            auVar59._24_4_ = auVar115._24_4_ * 0.0;
            auVar59._28_4_ = auVar115._28_4_;
            auVar8 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar96),auVar106);
            auVar60._4_4_ = auVar95._4_4_ * auVar106._4_4_;
            auVar60._0_4_ = auVar95._0_4_ * auVar106._0_4_;
            auVar60._8_4_ = auVar95._8_4_ * auVar106._8_4_;
            auVar60._12_4_ = auVar95._12_4_ * auVar106._12_4_;
            auVar60._16_4_ = auVar106._16_4_ * 0.0;
            auVar60._20_4_ = auVar106._20_4_ * 0.0;
            auVar60._24_4_ = auVar106._24_4_ * 0.0;
            auVar60._28_4_ = auVar106._28_4_;
            auVar91 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar94),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar110,ZEXT1632(auVar8));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar93));
            uVar88 = vcmpps_avx512vl(auVar104,auVar110,2);
            bVar82 = (byte)uVar88;
            fVar137 = (float)((uint)(bVar82 & 1) * auVar90._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar159._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar139 = (float)((uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar159._4_4_);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar141 = (float)((uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar159._8_4_);
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar143 = (float)((uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar159._12_4_);
            auVar111 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar137))));
            fVar138 = (float)((uint)(bVar82 & 1) * auVar5._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar160._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar140 = (float)((uint)bVar13 * auVar5._4_4_ | (uint)!bVar13 * auVar160._4_4_);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar142 = (float)((uint)bVar13 * auVar5._8_4_ | (uint)!bVar13 * auVar160._8_4_);
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar144 = (float)((uint)bVar13 * auVar5._12_4_ | (uint)!bVar13 * auVar160._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar138))));
            auVar132._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar114._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar183._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar183._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar183._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar183._12_4_);
            fVar166 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar114._16_4_);
            auVar132._16_4_ = fVar166;
            fVar145 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar114._20_4_);
            auVar132._20_4_ = fVar145;
            fVar171 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar114._24_4_);
            auVar132._24_4_ = fVar171;
            iVar1 = (uint)(byte)(uVar88 >> 7) * auVar114._28_4_;
            auVar132._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar94),auVar112);
            auVar133._0_4_ =
                 (uint)(bVar82 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar93._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar93._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar93._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar93._12_4_;
            auVar133._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar104._16_4_;
            auVar133._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar104._20_4_;
            auVar133._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar104._24_4_;
            auVar133._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar6));
            auVar134._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar90._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar90._4_4_);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar90._8_4_);
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar90._12_4_);
            fVar172 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar104._16_4_);
            auVar134._16_4_ = fVar172;
            fVar173 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar104._20_4_);
            auVar134._20_4_ = fVar173;
            fVar158 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar104._24_4_);
            auVar134._24_4_ = fVar158;
            auVar134._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar7));
            auVar135._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar5._0_4_);
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar5._4_4_);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar5._8_4_);
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar5._12_4_);
            fVar157 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar104._16_4_);
            auVar135._16_4_ = fVar157;
            fVar89 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar104._20_4_);
            auVar135._20_4_ = fVar89;
            fVar165 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar104._24_4_);
            auVar135._24_4_ = fVar165;
            iVar2 = (uint)(byte)(uVar88 >> 7) * auVar104._28_4_;
            auVar135._28_4_ = iVar2;
            auVar136._0_4_ =
                 (uint)(bVar82 & 1) * (int)auVar94._0_4_ |
                 (uint)!(bool)(bVar82 & 1) * auVar112._0_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar13 * (int)auVar94._4_4_ | (uint)!bVar13 * auVar112._4_4_;
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar13 * (int)auVar94._8_4_ | (uint)!bVar13 * auVar112._8_4_;
            bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar13 * (int)auVar94._12_4_ | (uint)!bVar13 * auVar112._12_4_;
            auVar136._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar112._16_4_;
            auVar136._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar112._20_4_;
            auVar136._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar112._24_4_;
            auVar136._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar112._28_4_;
            bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar88 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar112 = vsubps_avx512vl(auVar136,auVar111);
            auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar95._12_4_ |
                                                     (uint)!bVar17 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar95._8_4_ |
                                                              (uint)!bVar15 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar95._4_4_ |
                                                                       (uint)!bVar13 * auVar6._4_4_,
                                                                       (uint)(bVar82 & 1) *
                                                                       (int)auVar95._0_4_ |
                                                                       (uint)!(bool)(bVar82 & 1) *
                                                                       auVar6._0_4_)))),auVar101);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar96._12_4_ |
                                                     (uint)!bVar18 * auVar7._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar96._8_4_ |
                                                              (uint)!bVar16 * auVar7._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar96._4_4_ |
                                                                       (uint)!bVar14 * auVar7._4_4_,
                                                                       (uint)(bVar82 & 1) *
                                                                       (int)auVar96._0_4_ |
                                                                       (uint)!(bool)(bVar82 & 1) *
                                                                       auVar7._0_4_)))),auVar132);
            auVar113 = vsubps_avx(auVar111,auVar133);
            auVar106 = vsubps_avx(auVar101,auVar134);
            auVar107 = vsubps_avx(auVar132,auVar135);
            auVar61._4_4_ = auVar114._4_4_ * fVar139;
            auVar61._0_4_ = auVar114._0_4_ * fVar137;
            auVar61._8_4_ = auVar114._8_4_ * fVar141;
            auVar61._12_4_ = auVar114._12_4_ * fVar143;
            auVar61._16_4_ = auVar114._16_4_ * 0.0;
            auVar61._20_4_ = auVar114._20_4_ * 0.0;
            auVar61._24_4_ = auVar114._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar61,auVar132,auVar112);
            auVar164._0_4_ = fVar138 * auVar112._0_4_;
            auVar164._4_4_ = fVar140 * auVar112._4_4_;
            auVar164._8_4_ = fVar142 * auVar112._8_4_;
            auVar164._12_4_ = fVar144 * auVar112._12_4_;
            auVar164._16_4_ = auVar112._16_4_ * 0.0;
            auVar164._20_4_ = auVar112._20_4_ * 0.0;
            auVar164._24_4_ = auVar112._24_4_ * 0.0;
            auVar164._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar164,auVar111,auVar115);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar110,ZEXT1632(auVar93));
            auVar169._0_4_ = auVar115._0_4_ * auVar132._0_4_;
            auVar169._4_4_ = auVar115._4_4_ * auVar132._4_4_;
            auVar169._8_4_ = auVar115._8_4_ * auVar132._8_4_;
            auVar169._12_4_ = auVar115._12_4_ * auVar132._12_4_;
            auVar169._16_4_ = auVar115._16_4_ * fVar166;
            auVar169._20_4_ = auVar115._20_4_ * fVar145;
            auVar169._24_4_ = auVar115._24_4_ * fVar171;
            auVar169._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar169,auVar101,auVar114);
            auVar102 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar93));
            auVar104 = vmulps_avx512vl(auVar107,auVar133);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar113,auVar135);
            auVar62._4_4_ = auVar106._4_4_ * auVar135._4_4_;
            auVar62._0_4_ = auVar106._0_4_ * auVar135._0_4_;
            auVar62._8_4_ = auVar106._8_4_ * auVar135._8_4_;
            auVar62._12_4_ = auVar106._12_4_ * auVar135._12_4_;
            auVar62._16_4_ = auVar106._16_4_ * fVar157;
            auVar62._20_4_ = auVar106._20_4_ * fVar89;
            auVar62._24_4_ = auVar106._24_4_ * fVar165;
            auVar62._28_4_ = iVar2;
            auVar93 = vfmsub231ps_fma(auVar62,auVar134,auVar107);
            auVar170._0_4_ = auVar134._0_4_ * auVar113._0_4_;
            auVar170._4_4_ = auVar134._4_4_ * auVar113._4_4_;
            auVar170._8_4_ = auVar134._8_4_ * auVar113._8_4_;
            auVar170._12_4_ = auVar134._12_4_ * auVar113._12_4_;
            auVar170._16_4_ = fVar172 * auVar113._16_4_;
            auVar170._20_4_ = fVar173 * auVar113._20_4_;
            auVar170._24_4_ = fVar158 * auVar113._24_4_;
            auVar170._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar170,auVar106,auVar133);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar110,auVar104);
            auVar108 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar93));
            auVar104 = vmaxps_avx(auVar102,auVar108);
            uVar147 = vcmpps_avx512vl(auVar104,auVar110,2);
            local_290 = local_290 & (byte)uVar147;
            auVar190 = ZEXT3264(auVar180);
            if (local_290 == 0) {
LAB_01d1eead:
              local_290 = 0;
            }
            else {
              auVar63._4_4_ = auVar107._4_4_ * auVar115._4_4_;
              auVar63._0_4_ = auVar107._0_4_ * auVar115._0_4_;
              auVar63._8_4_ = auVar107._8_4_ * auVar115._8_4_;
              auVar63._12_4_ = auVar107._12_4_ * auVar115._12_4_;
              auVar63._16_4_ = auVar107._16_4_ * auVar115._16_4_;
              auVar63._20_4_ = auVar107._20_4_ * auVar115._20_4_;
              auVar63._24_4_ = auVar107._24_4_ * auVar115._24_4_;
              auVar63._28_4_ = auVar104._28_4_;
              auVar5 = vfmsub231ps_fma(auVar63,auVar106,auVar114);
              auVar64._4_4_ = auVar114._4_4_ * auVar113._4_4_;
              auVar64._0_4_ = auVar114._0_4_ * auVar113._0_4_;
              auVar64._8_4_ = auVar114._8_4_ * auVar113._8_4_;
              auVar64._12_4_ = auVar114._12_4_ * auVar113._12_4_;
              auVar64._16_4_ = auVar114._16_4_ * auVar113._16_4_;
              auVar64._20_4_ = auVar114._20_4_ * auVar113._20_4_;
              auVar64._24_4_ = auVar114._24_4_ * auVar113._24_4_;
              auVar64._28_4_ = auVar114._28_4_;
              auVar90 = vfmsub231ps_fma(auVar64,auVar112,auVar107);
              auVar65._4_4_ = auVar106._4_4_ * auVar112._4_4_;
              auVar65._0_4_ = auVar106._0_4_ * auVar112._0_4_;
              auVar65._8_4_ = auVar106._8_4_ * auVar112._8_4_;
              auVar65._12_4_ = auVar106._12_4_ * auVar112._12_4_;
              auVar65._16_4_ = auVar106._16_4_ * auVar112._16_4_;
              auVar65._20_4_ = auVar106._20_4_ * auVar112._20_4_;
              auVar65._24_4_ = auVar106._24_4_ * auVar112._24_4_;
              auVar65._28_4_ = auVar106._28_4_;
              auVar6 = vfmsub231ps_fma(auVar65,auVar113,auVar115);
              auVar93 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar6));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar5),auVar110);
              auVar115 = vrcp14ps_avx512vl(auVar104);
              auVar27._8_4_ = 0x3f800000;
              auVar27._0_8_ = &DAT_3f8000003f800000;
              auVar27._12_4_ = 0x3f800000;
              auVar27._16_4_ = 0x3f800000;
              auVar27._20_4_ = 0x3f800000;
              auVar27._24_4_ = 0x3f800000;
              auVar27._28_4_ = 0x3f800000;
              auVar114 = vfnmadd213ps_avx512vl(auVar115,auVar104,auVar27);
              auVar93 = vfmadd132ps_fma(auVar114,auVar115,auVar115);
              auVar66._4_4_ = auVar6._4_4_ * auVar132._4_4_;
              auVar66._0_4_ = auVar6._0_4_ * auVar132._0_4_;
              auVar66._8_4_ = auVar6._8_4_ * auVar132._8_4_;
              auVar66._12_4_ = auVar6._12_4_ * auVar132._12_4_;
              auVar66._16_4_ = fVar166 * 0.0;
              auVar66._20_4_ = fVar145 * 0.0;
              auVar66._24_4_ = fVar171 * 0.0;
              auVar66._28_4_ = iVar1;
              auVar90 = vfmadd231ps_fma(auVar66,auVar101,ZEXT1632(auVar90));
              auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar111,ZEXT1632(auVar5));
              fVar166 = auVar93._0_4_;
              fVar145 = auVar93._4_4_;
              fVar171 = auVar93._8_4_;
              fVar172 = auVar93._12_4_;
              auVar115 = ZEXT1632(CONCAT412(auVar90._12_4_ * fVar172,
                                            CONCAT48(auVar90._8_4_ * fVar171,
                                                     CONCAT44(auVar90._4_4_ * fVar145,
                                                              auVar90._0_4_ * fVar166))));
              auVar78._4_4_ = uStack_3fc;
              auVar78._0_4_ = local_400;
              auVar78._8_4_ = uStack_3f8;
              auVar78._12_4_ = uStack_3f4;
              auVar78._16_4_ = uStack_3f0;
              auVar78._20_4_ = uStack_3ec;
              auVar78._24_4_ = uStack_3e8;
              auVar78._28_4_ = uStack_3e4;
              uVar147 = vcmpps_avx512vl(auVar115,auVar78,0xd);
              uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar28._4_4_ = uVar146;
              auVar28._0_4_ = uVar146;
              auVar28._8_4_ = uVar146;
              auVar28._12_4_ = uVar146;
              auVar28._16_4_ = uVar146;
              auVar28._20_4_ = uVar146;
              auVar28._24_4_ = uVar146;
              auVar28._28_4_ = uVar146;
              uVar21 = vcmpps_avx512vl(auVar115,auVar28,2);
              local_290 = (byte)uVar147 & (byte)uVar21 & local_290;
              if (local_290 == 0) goto LAB_01d1eead;
              uVar147 = vcmpps_avx512vl(auVar104,auVar110,4);
              if ((local_290 & (byte)uVar147) == 0) {
                local_290 = 0;
              }
              else {
                local_290 = local_290 & (byte)uVar147;
                fVar173 = auVar102._0_4_ * fVar166;
                fVar158 = auVar102._4_4_ * fVar145;
                auVar67._4_4_ = fVar158;
                auVar67._0_4_ = fVar173;
                fVar165 = auVar102._8_4_ * fVar171;
                auVar67._8_4_ = fVar165;
                fVar89 = auVar102._12_4_ * fVar172;
                auVar67._12_4_ = fVar89;
                fVar157 = auVar102._16_4_ * 0.0;
                auVar67._16_4_ = fVar157;
                fVar137 = auVar102._20_4_ * 0.0;
                auVar67._20_4_ = fVar137;
                fVar138 = auVar102._24_4_ * 0.0;
                auVar67._24_4_ = fVar138;
                auVar67._28_4_ = auVar102._28_4_;
                fVar166 = auVar108._0_4_ * fVar166;
                fVar145 = auVar108._4_4_ * fVar145;
                auVar68._4_4_ = fVar145;
                auVar68._0_4_ = fVar166;
                fVar171 = auVar108._8_4_ * fVar171;
                auVar68._8_4_ = fVar171;
                fVar172 = auVar108._12_4_ * fVar172;
                auVar68._12_4_ = fVar172;
                fVar139 = auVar108._16_4_ * 0.0;
                auVar68._16_4_ = fVar139;
                fVar140 = auVar108._20_4_ * 0.0;
                auVar68._20_4_ = fVar140;
                fVar141 = auVar108._24_4_ * 0.0;
                auVar68._24_4_ = fVar141;
                auVar68._28_4_ = auVar108._28_4_;
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = &DAT_3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx512vl(auVar177,auVar67);
                bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar88 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar88 >> 6) & 1);
                bVar19 = SUB81(uVar88 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar102._28_4_ |
                                              (uint)!bVar19 * auVar104._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar138 |
                                                        (uint)!bVar18 * auVar104._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar137 |
                                                                  (uint)!bVar17 * auVar104._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar157 |
                                                                            (uint)!bVar16 *
                                                                            auVar104._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar89 |
                                                                                      (uint)!bVar15
                                                                                      * auVar104.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar165 |
                                                                  (uint)!bVar14 * auVar104._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar158 |
                                                                           (uint)!bVar13 *
                                                                           auVar104._4_4_,
                                                                           (uint)(bVar82 & 1) *
                                                                           (int)fVar173 |
                                                                           (uint)!(bool)(bVar82 & 1)
                                                                           * auVar104._0_4_))))))));
                auVar104 = vsubps_avx(auVar177,auVar68);
                bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar88 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar88 >> 6) & 1);
                bVar19 = SUB81(uVar88 >> 7,0);
                local_220._4_4_ = (uint)bVar13 * (int)fVar145 | (uint)!bVar13 * auVar104._4_4_;
                local_220._0_4_ =
                     (uint)(bVar82 & 1) * (int)fVar166 | (uint)!(bool)(bVar82 & 1) * auVar104._0_4_;
                local_220._8_4_ = (uint)bVar14 * (int)fVar171 | (uint)!bVar14 * auVar104._8_4_;
                local_220._12_4_ = (uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar104._12_4_;
                local_220._16_4_ = (uint)bVar16 * (int)fVar139 | (uint)!bVar16 * auVar104._16_4_;
                local_220._20_4_ = (uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar104._20_4_;
                local_220._24_4_ = (uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar104._24_4_;
                local_220._28_4_ = (uint)bVar19 * auVar108._28_4_ | (uint)!bVar19 * auVar104._28_4_;
                in_ZMM21 = ZEXT3264(auVar115);
              }
            }
            auVar194 = ZEXT3264(local_5e0);
            if (local_290 == 0) goto LAB_01d1ee6c;
            auVar104 = vsubps_avx(ZEXT1632(auVar92),auVar99);
            local_4c0 = in_ZMM20._0_32_;
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_4c0,auVar99);
            auVar153._0_4_ = auVar104._0_4_ + auVar104._0_4_;
            auVar153._4_4_ = auVar104._4_4_ + auVar104._4_4_;
            auVar153._8_4_ = auVar104._8_4_ + auVar104._8_4_;
            auVar153._12_4_ = auVar104._12_4_ + auVar104._12_4_;
            auVar153._16_4_ = auVar104._16_4_ + auVar104._16_4_;
            auVar153._20_4_ = auVar104._20_4_ + auVar104._20_4_;
            auVar153._24_4_ = auVar104._24_4_ + auVar104._24_4_;
            auVar153._28_4_ = auVar104._28_4_ + auVar104._28_4_;
            uVar146 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar29._4_4_ = uVar146;
            auVar29._0_4_ = uVar146;
            auVar29._8_4_ = uVar146;
            auVar29._12_4_ = uVar146;
            auVar29._16_4_ = uVar146;
            auVar29._20_4_ = uVar146;
            auVar29._24_4_ = uVar146;
            auVar29._28_4_ = uVar146;
            auVar104 = vmulps_avx512vl(auVar153,auVar29);
            local_4e0 = in_ZMM21._0_32_;
            uVar147 = vcmpps_avx512vl(local_4e0,auVar104,6);
            local_290 = local_290 & (byte)uVar147;
            if (local_290 == 0) goto LAB_01d1ee6c;
            auVar154._8_4_ = 0xbf800000;
            auVar154._0_8_ = 0xbf800000bf800000;
            auVar154._12_4_ = 0xbf800000;
            auVar154._16_4_ = 0xbf800000;
            auVar154._20_4_ = 0xbf800000;
            auVar154._24_4_ = 0xbf800000;
            auVar154._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_320 = vfmadd132ps_avx512vl(local_220,auVar154,auVar30);
            local_220 = local_320;
            auVar104 = local_220;
            local_2e0 = (undefined4)lVar84;
            local_2c0 = local_430._0_8_;
            uStack_2b8 = local_430._8_8_;
            local_2b0 = local_440._0_8_;
            uStack_2a8 = local_440._8_8_;
            local_2a0 = local_450._0_8_;
            uStack_298 = local_450._8_8_;
            pGVar11 = (context->scene->geometries).items[local_6b8].ptr;
            local_680 = (undefined1  [8])pGVar11;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar82 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar82 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar115 = vaddps_avx512vl(local_4c0,_DAT_02020f40);
              auVar93 = vcvtsi2ss_avx512f(auVar195._0_16_,local_2e0);
              fVar166 = auVar93._0_4_;
              local_280[0] = (fVar166 + auVar115._0_4_) * local_420;
              local_280[1] = (fVar166 + auVar115._4_4_) * fStack_41c;
              local_280[2] = (fVar166 + auVar115._8_4_) * fStack_418;
              local_280[3] = (fVar166 + auVar115._12_4_) * fStack_414;
              fStack_270 = (fVar166 + auVar115._16_4_) * fStack_410;
              fStack_26c = (fVar166 + auVar115._20_4_) * fStack_40c;
              fStack_268 = (fVar166 + auVar115._24_4_) * fStack_408;
              fStack_264 = fVar166 + auVar115._28_4_;
              local_220._0_8_ = local_320._0_8_;
              local_220._8_8_ = local_320._8_8_;
              local_220._16_8_ = local_320._16_8_;
              local_220._24_8_ = local_320._24_8_;
              local_260 = local_220._0_8_;
              uStack_258 = local_220._8_8_;
              uStack_250 = local_220._16_8_;
              uStack_248 = local_220._24_8_;
              local_240 = local_4e0;
              local_590 = local_430._0_4_;
              fStack_58c = local_430._4_4_;
              fStack_588 = local_430._8_4_;
              fStack_584 = local_430._12_4_;
              uVar88 = 0;
              uVar80 = (ulong)local_290;
              for (uVar81 = uVar80; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                uVar88 = uVar88 + 1;
              }
              local_660 = local_440;
              local_1b0 = local_450._0_8_;
              uStack_1a8 = local_450._8_8_;
              uVar81 = 0x2227201;
              local_568 = lVar84;
              local_340 = local_4c0;
              local_300 = local_4e0;
              local_2dc = iVar10;
              local_2d0 = auVar20;
              local_220 = auVar104;
              do {
                local_650 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_3a0 = local_280[uVar88];
                local_390 = *(undefined4 *)((long)&local_260 + uVar88 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar88 * 4);
                local_6b0.context = context->user;
                fVar145 = 1.0 - local_3a0;
                fVar166 = fVar145 * fVar145 * -3.0;
                auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                          ZEXT416((uint)(local_3a0 * fVar145)),ZEXT416(0xc0000000));
                auVar92 = vfmsub132ss_fma(ZEXT416((uint)(local_3a0 * fVar145)),
                                          ZEXT416((uint)(local_3a0 * local_3a0)),ZEXT416(0x40000000)
                                         );
                fVar145 = auVar93._0_4_ * 3.0;
                fVar171 = auVar92._0_4_ * 3.0;
                fVar172 = local_3a0 * local_3a0 * 3.0;
                auVar175._0_4_ = fVar172 * (float)local_1b0;
                auVar175._4_4_ = fVar172 * local_1b0._4_4_;
                auVar175._8_4_ = fVar172 * (float)uStack_1a8;
                auVar175._12_4_ = fVar172 * uStack_1a8._4_4_;
                auVar150._4_4_ = fVar171;
                auVar150._0_4_ = fVar171;
                auVar150._8_4_ = fVar171;
                auVar150._12_4_ = fVar171;
                auVar93 = vfmadd132ps_fma(auVar150,auVar175,local_660);
                auVar162._4_4_ = fVar145;
                auVar162._0_4_ = fVar145;
                auVar162._8_4_ = fVar145;
                auVar162._12_4_ = fVar145;
                auVar76._4_4_ = fStack_58c;
                auVar76._0_4_ = local_590;
                auVar76._8_4_ = fStack_588;
                auVar76._12_4_ = fStack_584;
                auVar93 = vfmadd132ps_fma(auVar162,auVar93,auVar76);
                auVar151._4_4_ = fVar166;
                auVar151._0_4_ = fVar166;
                auVar151._8_4_ = fVar166;
                auVar151._12_4_ = fVar166;
                auVar93 = vfmadd213ps_fma(auVar151,auVar20,auVar93);
                local_3d0 = auVar93._0_4_;
                local_3c0 = vshufps_avx(auVar93,auVar93,0x55);
                local_3b0 = vshufps_avx(auVar93,auVar93,0xaa);
                local_380 = local_580._0_8_;
                uStack_378 = local_580._8_8_;
                local_370 = local_610;
                vpcmpeqd_avx2(ZEXT1632(local_610),ZEXT1632(local_610));
                uStack_35c = (local_6b0.context)->instID[0];
                local_360 = uStack_35c;
                uStack_358 = uStack_35c;
                uStack_354 = uStack_35c;
                uStack_350 = (local_6b0.context)->instPrimID[0];
                uStack_34c = uStack_350;
                uStack_348 = uStack_350;
                uStack_344 = uStack_350;
                local_6d0 = local_460._0_8_;
                uStack_6c8 = local_460._8_8_;
                local_6b0.valid = (int *)&local_6d0;
                local_6b0.geometryUserPtr = *(void **)((long)local_680 + 0x18);
                local_6b0.hit = (RTCHitN *)&local_3d0;
                local_6b0.N = 4;
                local_620._0_4_ = (int)uVar81;
                local_630._0_8_ = uVar80;
                local_640._0_8_ = uVar88;
                uVar83 = uVar88;
                local_6b0.ray = (RTCRayN *)ray;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                fStack_39c = local_3a0;
                fStack_398 = local_3a0;
                fStack_394 = local_3a0;
                uStack_38c = local_390;
                uStack_388 = local_390;
                uStack_384 = local_390;
                if (*(code **)((long)local_680 + 0x48) != (code *)0x0) {
                  (**(code **)((long)local_680 + 0x48))(&local_6b0);
                  uVar81 = (ulong)(uint)local_620._0_4_;
                  uVar80 = local_630._0_8_;
                  uVar83 = local_640._0_8_;
                }
                auVar73._8_8_ = uStack_6c8;
                auVar73._0_8_ = local_6d0;
                uVar88 = vptestmd_avx512vl(auVar73,auVar73);
                if ((uVar88 & 0xf) != 0) {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_680 + 0x3e) & 0x40) != 0)))) {
                    (*p_Var12)(&local_6b0);
                    uVar81 = (ulong)(uint)local_620._0_4_;
                    uVar80 = local_630._0_8_;
                    uVar83 = local_640._0_8_;
                  }
                  auVar90 = auVar197._0_16_;
                  auVar74._8_8_ = uStack_6c8;
                  auVar74._0_8_ = local_6d0;
                  auVar93 = *(undefined1 (*) [16])(local_6b0.ray + 0x80);
                  uVar88 = vptestmd_avx512vl(auVar74,auVar74);
                  uVar88 = uVar88 & 0xf;
                  auVar92 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar88 & 1);
                  auVar98._0_4_ = (uint)bVar13 * auVar92._0_4_ | (uint)!bVar13 * auVar93._0_4_;
                  bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar98._4_4_ = (uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar93._4_4_;
                  bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar98._8_4_ = (uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar93._8_4_;
                  bVar13 = SUB81(uVar88 >> 3,0);
                  auVar98._12_4_ = (uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar93._12_4_;
                  *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar98;
                  if ((byte)uVar88 != 0) break;
                }
                auVar90 = auVar197._0_16_;
                *(undefined4 *)(ray + k * 4 + 0x80) = local_650;
                uVar88 = 0;
                uVar80 = uVar80 ^ 1L << (uVar83 & 0x3f);
                for (uVar83 = uVar80; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000)
                {
                  uVar88 = uVar88 + 1;
                }
                uVar81 = CONCAT71((int7)(uVar81 >> 8),uVar80 != 0);
              } while (uVar80 != 0);
              bVar82 = (byte)uVar81 & 1;
              auVar93 = vxorps_avx512vl(auVar90,auVar90);
              auVar197 = ZEXT1664(auVar93);
              in_ZMM20 = ZEXT3264(local_4c0);
              in_ZMM21 = ZEXT3264(local_4e0);
              auVar196 = ZEXT3264(local_480);
              auVar190 = ZEXT3264(local_4a0);
              auVar194 = ZEXT3264(local_5e0);
              auVar198 = ZEXT3264(local_520);
              auVar199 = ZEXT3264(local_540);
              lVar84 = local_568;
            }
            uVar85 = CONCAT31(local_600._1_3_,local_600[0] | bVar82);
          }
          auVar179 = ZEXT3264(auVar103);
          auVar156 = ZEXT3264(auVar105);
          uVar88 = (ulong)uVar85;
          lVar84 = lVar84 + 8;
          auVar195 = auVar190;
        } while ((int)lVar84 < iVar10);
      }
      if ((uVar88 & 1) != 0) {
        return bVar87;
      }
      uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar26._4_4_ = uVar146;
      auVar26._0_4_ = uVar146;
      auVar26._8_4_ = uVar146;
      auVar26._12_4_ = uVar146;
      auVar26._16_4_ = uVar146;
      auVar26._20_4_ = uVar146;
      auVar26._24_4_ = uVar146;
      auVar26._28_4_ = uVar146;
      uVar147 = vcmpps_avx512vl(local_80,auVar26,2);
      uVar85 = (uint)uVar86 & (uint)uVar147;
      uVar86 = (ulong)uVar85;
      bVar87 = uVar85 != 0;
    } while (bVar87);
  }
  return bVar87;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }